

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

WhereInfo *
sqlite3WhereBegin(Parse *pParse,SrcList *pTabList,Expr *pWhere,ExprList *pOrderBy,
                 ExprList *pResultSet,u16 wctrlFlags,int iAuxArg)

{
  WhereClause *pWC;
  WhereLevel *__s;
  u32 *puVar1;
  undefined1 *puVar2;
  byte *pbVar3;
  WhereMaskSet *pMaskSet;
  byte bVar4;
  ushort uVar5;
  short sVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  Vdbe *p;
  sqlite3 *db;
  ExprList *pEVar10;
  WhereLoop *pWVar11;
  Vdbe *pVVar12;
  sqlite3 *psVar13;
  WhereOrInfo *pWVar14;
  SrcList *pSVar15;
  sqlite3 *db_00;
  WhereLoop *pWVar16;
  Parse *pPVar17;
  bool bVar18;
  undefined2 uVar19;
  u8 uVar20;
  byte bVar21;
  char cVar22;
  u16 wctrlFlags_00;
  LogEst LVar23;
  i16 iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int p3;
  WhereInfo *pWInfo;
  Expr *pEVar31;
  Expr *pEVar32;
  WhereClause *pWVar33;
  WhereTerm *pWVar34;
  Bitmask BVar35;
  Bitmask BVar36;
  VTable *zP4;
  Index **ppIVar37;
  CollSeq *pCVar38;
  SrcList *pSVar39;
  ulong uVar40;
  char *zAff;
  Index *pIVar41;
  Parse *pPVar42;
  WhereInfo *pWVar43;
  VdbeOp *pVVar44;
  int *piVar45;
  int iVar46;
  u32 uVar47;
  int iVar48;
  ulong uVar49;
  u16 uVar50;
  int iVar51;
  Table *pTVar52;
  char *pcVar53;
  ulong uVar54;
  byte bVar55;
  uint uVar56;
  int iVar57;
  uint p4;
  uint uVar58;
  long lVar59;
  Index *pIVar60;
  anon_union_8_3_737c4e49_for_u *paVar61;
  WhereMaskSet *pMaskSet_00;
  SrcList_item *pSVar62;
  ExprList *pEVar63;
  SrcList_item *pSVar64;
  SrcList *pSVar65;
  Expr *pEVar66;
  WhereTerm *pWVar67;
  uint uVar68;
  ExprList_item *pEVar69;
  SrcList *pSVar70;
  ulong uVar71;
  WhereLevel *pWVar72;
  ulong uVar73;
  long lVar74;
  int *piVar75;
  WhereTerm *pWVar76;
  uint uVar77;
  long lVar78;
  bool bVar79;
  bool bVar80;
  byte bVar81;
  ulong local_1c0;
  Expr *local_1b0;
  Expr *local_1a8;
  SrcList *local_1a0;
  uint local_190;
  Bitmask local_188;
  ulong local_180;
  uint local_158;
  WhereTerm *local_148;
  uint local_140;
  ulong local_120;
  Index *local_118;
  int local_f8;
  int local_e4;
  WhereLoopBuilder local_c8;
  undefined1 local_98 [40];
  anon_union_8_14_c5524298_for_u aStack_70;
  ulong local_50;
  Expr *local_48;
  int local_40;
  int local_3c;
  undefined4 local_38;
  
  bVar81 = 0;
  p = pParse->pVdbe;
  db = pParse->db;
  local_c8.pOrSet = (WhereOrSet *)0x0;
  local_c8.bldFlags = 0;
  local_c8.iPlanLimit = 0;
  pEVar63 = (ExprList *)0x0;
  if ((pOrderBy != (ExprList *)0x0) && (pOrderBy->nExpr < 0x40)) {
    pEVar63 = pOrderBy;
  }
  uVar27 = wctrlFlags & 0x7eff;
  if ((db->dbOptFlags & 0x10) == 0) {
    uVar27 = (uint)wctrlFlags;
  }
  local_190 = pTabList->nSrc;
  local_c8.pOrderBy = pEVar63;
  if (0x40 < (int)local_190) {
    sqlite3ErrorMsg(pParse,"at most %d tables in a join",0x40);
    return (WhereInfo *)0x0;
  }
  if ((uVar27 & 0x20) != 0) {
    local_190 = 1;
  }
  uVar73 = (long)(int)(local_190 * 0x58 + 0x39f) & 0xfffffffffffffff8;
  pWInfo = (WhereInfo *)sqlite3DbMallocRawNN(db,uVar73 + 0x60);
  if (db->mallocFailed != '\0') {
    sqlite3DbFree(db,pWInfo);
    return (WhereInfo *)0x0;
  }
  uVar56 = uVar27 & 0x20;
  pWInfo->pParse = pParse;
  pWInfo->pTabList = pTabList;
  pWInfo->pOrderBy = pEVar63;
  pWInfo->pWhere = pWhere;
  pWInfo->pResultSet = pResultSet;
  pWInfo->aiCurOnePass[0] = -1;
  pWInfo->aiCurOnePass[1] = -1;
  pWInfo->nLevel = (u8)local_190;
  iVar25 = pParse->nLabel + -1;
  pParse->nLabel = iVar25;
  pWInfo->iContinue = iVar25;
  pWInfo->iBreak = iVar25;
  wctrlFlags_00 = (u16)uVar27;
  pWInfo->wctrlFlags = wctrlFlags_00;
  pWInfo->iLimit = (LogEst)iAuxArg;
  pWInfo->savedNQueryLoop = pParse->nQueryLoop;
  pWInfo->nOBSat = '\0';
  pWInfo->sorted = '\0';
  pWInfo->eOnePass = '\0';
  pWInfo->untestedTerms = '\0';
  pWInfo->eDistinct = '\0';
  pWInfo->bOrderedInnerLoop = '\0';
  *(undefined2 *)&pWInfo->field_0x49 = 0;
  *(undefined8 *)&pWInfo->field_0x4b = 0;
  *(undefined8 *)((long)&pWInfo->pLoops + 3) = 0;
  *(undefined8 *)((long)&pWInfo->revMask + 3) = 0;
  *(undefined8 *)&pWInfo->nRowOut = 0;
  __s = pWInfo->a;
  memset(__s,0,(long)(int)local_190 * 0x58 + 0x60);
  pWC = &pWInfo->sWC;
  local_c8.pNew = (WhereLoop *)((long)pWInfo->aiCurOnePass + (uVar73 - 0x2c));
  *(ulong *)((long)pWInfo->aiCurOnePass + uVar73 + 0xc) = (long)pWInfo->aiCurOnePass + uVar73 + 0x1c
  ;
  *(undefined2 *)((long)pWInfo->aiCurOnePass + uVar73) = 0;
  *(undefined2 *)((long)pWInfo->aiCurOnePass + uVar73 + 4) = 3;
  *(undefined4 *)((long)pWInfo->aiCurOnePass + (uVar73 - 4)) = 0;
  (pWInfo->sMaskSet).n = 0;
  (pWInfo->sWC).pWInfo = pWInfo;
  (pWInfo->sWC).hasOr = '\0';
  (pWInfo->sWC).pOuter = (WhereClause *)0x0;
  (pWInfo->sWC).nTerm = 0;
  (pWInfo->sWC).nSlot = 8;
  (pWInfo->sWC).a = (pWInfo->sWC).aStatic;
  local_c8.pWInfo = pWInfo;
  local_c8.pWC = pWC;
  sqlite3WhereSplit(pWC,pWhere,',');
  if (local_190 == 0) {
    if (pEVar63 != (ExprList *)0x0) {
      pWInfo->nOBSat = (i8)pEVar63->nExpr;
    }
    if ((uVar27 >> 8 & 1) != 0) {
      pWInfo->eDistinct = '\x01';
    }
    sqlite3VdbeExplain(pParse,'\0',"SCAN CONSTANT ROW");
  }
  else {
    lVar59 = 0;
    do {
      iVar25 = pTabList->a[lVar59].iCursor;
      iVar51 = (pWInfo->sMaskSet).n;
      (pWInfo->sMaskSet).n = iVar51 + 1;
      (pWInfo->sMaskSet).ix[iVar51] = iVar25;
      if (((pTabList->a[lVar59].fg.field_0x1 & 4) != 0) &&
         (pEVar10 = pTabList->a[lVar59].u1.pFuncArg, pEVar10 != (ExprList *)0x0)) {
        pTVar52 = pTabList->a[lVar59].pTab;
        lVar78 = 0;
        for (uVar73 = 0; (long)uVar73 < (long)pEVar10->nExpr; uVar73 = uVar73 + 1) {
          lVar74 = (long)(int)lVar78;
          uVar49 = lVar74 << 5 | 0x1b;
          while( true ) {
            if (pTVar52->nCol <= lVar74) {
              sqlite3ErrorMsg(pParse,"too many arguments on %s() - max %d",pTVar52->zName,
                              uVar73 & 0xffffffff);
              goto LAB_00197a52;
            }
            if ((*(byte *)((long)&pTVar52->aCol->zName + uVar49) & 2) != 0) break;
            lVar74 = lVar74 + 1;
            uVar49 = uVar49 + 0x20;
          }
          pEVar31 = sqlite3ExprAlloc(pParse->db,0xa2,(Token *)0x0,0);
          if (pEVar31 == (Expr *)0x0) break;
          pEVar31->iTable = pTabList->a[lVar59].iCursor;
          lVar78 = lVar74 + 1;
          pEVar31->iColumn = (ynVar)lVar74;
          (pEVar31->y).pTab = pTVar52;
          pEVar32 = sqlite3ExprDup(pParse->db,pEVar10->a[uVar73].pExpr,0);
          pEVar32 = sqlite3PExpr(pParse,0xa6,pEVar32,(Expr *)0x0);
          pEVar31 = sqlite3PExpr(pParse,0x35,pEVar31,pEVar32);
          whereClauseInsert(pWC,pEVar31,1);
        }
      }
LAB_00197a52:
      lVar59 = lVar59 + 1;
    } while (lVar59 < pTabList->nSrc);
  }
  sqlite3WhereExprAnalyze(pTabList,pWC);
  if (db->mallocFailed == '\0') {
    pMaskSet = &pWInfo->sMaskSet;
    lVar78 = 0;
    pWVar33 = pWC;
    for (lVar59 = 0; lVar59 < pWVar33->nTerm; lVar59 = lVar59 + 1) {
      pWVar34 = pWVar33->a;
      if (((*(byte *)((long)&pWVar34->wtFlags + lVar78) & 2) == 0) &&
         (*(long *)((long)&pWVar34->prereqAll + lVar78) == 0)) {
        if (local_190 != 0) {
          aStack_70.pNC = (NameContext *)0x0;
          local_98._0_8_ = (Parse *)0x0;
          local_98._24_8_ = (Expr *)0x0;
          local_98._32_8_ = (anon_union_8_2_a01b6dbf_for_x)0x100000000;
          local_98._8_8_ = exprNodeIsDeterministic;
          local_98._16_8_ = sqlite3SelectWalkFail;
          sqlite3WalkExpr((Walker *)local_98,*(Expr **)((long)&pWVar34->pExpr + lVar78));
          if (local_98[0x24] == '\0') goto LAB_00197b97;
        }
        sqlite3ExprIfFalse(pParse,*(Expr **)((long)&pWVar34->pExpr + lVar78),pWInfo->iBreak,0x10);
        pbVar3 = (byte *)((long)&pWVar34->wtFlags + lVar78);
        *pbVar3 = *pbVar3 | 4;
      }
LAB_00197b97:
      lVar78 = lVar78 + 0x40;
      pWVar33 = local_c8.pWC;
    }
    if ((uVar27 >> 8 & 1) != 0) {
      if (pTabList->nSrc == 1) {
        iVar25 = pTabList->a[0].iCursor;
        pTVar52 = pTabList->a[0].pTab;
        uVar49 = 0;
        uVar73 = (ulong)(uint)pResultSet->nExpr;
        if (pResultSet->nExpr < 1) {
          uVar73 = uVar49;
        }
        for (; uVar73 * 0x20 != uVar49; uVar49 = uVar49 + 0x20) {
          pEVar31 = sqlite3ExprSkipCollate(*(Expr **)((long)&pResultSet->a[0].pExpr + uVar49));
          if (((pEVar31->op == 0xa2) && (pEVar31->iTable == iVar25)) && (pEVar31->iColumn < 0))
          goto LAB_00197d2b;
        }
        ppIVar37 = &pTVar52->pIndex;
        while (pIVar60 = *ppIVar37, pIVar60 != (Index *)0x0) {
          if (pIVar60->onError != '\0') {
            uVar73 = 0;
LAB_00197c43:
            if (uVar73 < pIVar60->nKeyCol) {
              pWVar34 = sqlite3WhereFindTerm(pWC,iVar25,(int)uVar73,0xffffffffffffffff,2,pIVar60);
              if (pWVar34 == (WhereTerm *)0x0) {
                pcVar53 = pIVar60->azColl[uVar73];
                lVar59 = 0;
                pEVar69 = pResultSet->a;
                do {
                  if (pResultSet->nExpr <= lVar59) goto LAB_00197cf7;
                  pEVar31 = pEVar69->pExpr;
                  pEVar32 = sqlite3ExprSkipCollate(pEVar31);
                  if (((pEVar32->op == 0xa2) && (pEVar32->iColumn == pIVar60->aiColumn[uVar73])) &&
                     (pEVar32->iTable == iVar25)) {
                    pCVar38 = sqlite3ExprNNCollSeq(pParse,pEVar31);
                    iVar51 = sqlite3StrICmp(pCVar38->zName,pcVar53);
                    if (iVar51 == 0) goto LAB_00197ce4;
                  }
                  lVar59 = lVar59 + 1;
                  pEVar69 = pEVar69 + 1;
                } while( true );
              }
              goto LAB_00197c72;
            }
LAB_00197cf7:
            if (uVar73 == pIVar60->nKeyCol) goto LAB_00197d2b;
          }
          ppIVar37 = &pIVar60->pNext;
        }
      }
      if (pEVar63 == (ExprList *)0x0) {
        *(byte *)&pWInfo->wctrlFlags = (byte)pWInfo->wctrlFlags | 0x80;
        pWInfo->pOrderBy = pResultSet;
      }
    }
    goto LAB_00197d30;
  }
LAB_001980c8:
  if (pWInfo == (WhereInfo *)0x0) {
    return (WhereInfo *)0x0;
  }
LAB_001980cd:
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db,pWInfo);
  return (WhereInfo *)0x0;
LAB_00197ce4:
  iVar51 = indexColumnNotNull(pIVar60,(int)uVar73);
  if (iVar51 == 0) goto LAB_00197cf7;
LAB_00197c72:
  uVar73 = uVar73 + 1;
  goto LAB_00197c43;
LAB_00197d2b:
  pWInfo->eDistinct = '\x01';
LAB_00197d30:
  pWVar11 = local_c8.pNew;
  pWVar43 = local_c8.pWInfo;
  if ((local_190 == 1) && (((local_c8.pWInfo)->wctrlFlags & 0x20) == 0)) {
    pSVar70 = (local_c8.pWInfo)->pTabList;
    pTVar52 = pSVar70->a[0].pTab;
    if ((pTVar52->nModuleArg != 0) || ((pSVar70->a[0].fg.field_0x1 & 2) != 0)) goto LAB_00197ec9;
    iVar25 = pSVar70->a[0].iCursor;
    (local_c8.pNew)->wsFlags = 0;
    pWVar33 = &(local_c8.pWInfo)->sWC;
    (local_c8.pNew)->nSkip = 0;
    pWVar34 = sqlite3WhereFindTerm(pWVar33,iVar25,-1,0,0x82,(Index *)0x0);
    if (pWVar34 == (WhereTerm *)0x0) {
      ppIVar37 = &pTVar52->pIndex;
      while (pIVar60 = *ppIVar37, pIVar60 != (Index *)0x0) {
        if (((pIVar60->onError != '\0') && (pIVar60->pPartIdxWhere == (Expr *)0x0)) &&
           (uVar73 = (ulong)pIVar60->nKeyCol, pIVar60->nKeyCol < 4)) {
          bVar21 = pIVar60->field_0x63;
          for (uVar49 = 0; uVar49 < uVar73; uVar49 = uVar49 + 1) {
            pWVar34 = sqlite3WhereFindTerm
                                (pWVar33,iVar25,(int)uVar49,0,(uint)((bVar21 & 8) >> 3) << 7 | 2,
                                 pIVar60);
            uVar73 = (ulong)pIVar60->nKeyCol;
            if (pWVar34 == (WhereTerm *)0x0) break;
            pWVar11->aLTerm[uVar49] = pWVar34;
          }
          if (uVar73 == uVar49) {
            pWVar11->wsFlags = 0x1201;
            if (((pIVar60->field_0x63 & 0x20) != 0) ||
               ((pSVar70->a[0].colUsed & pIVar60->colNotIdxed) == 0)) {
              pWVar11->wsFlags = 0x1241;
            }
            pWVar11->nLTerm = (u16)uVar49;
            (pWVar11->u).btree.nEq = (u16)uVar49;
            (pWVar11->u).btree.pIndex = pIVar60;
            LVar23 = 0x27;
            goto LAB_00197dcd;
          }
        }
        ppIVar37 = &pIVar60->pNext;
      }
      if (pWVar11->wsFlags == 0) goto LAB_00197ec9;
    }
    else {
      pWVar11->wsFlags = 0x1101;
      *pWVar11->aLTerm = pWVar34;
      pWVar11->nLTerm = 1;
      (pWVar11->u).btree.nEq = 1;
      LVar23 = 0x21;
LAB_00197dcd:
      pWVar11->rRun = LVar23;
    }
    pWVar11->nOut = 1;
    pWVar43->a[0].pWLoop = pWVar11;
    pWVar11->maskSelf = 1;
    pWVar43->a[0].iTabCur = iVar25;
    pWVar43->nRowOut = 1;
    if (pWVar43->pOrderBy != (ExprList *)0x0) {
      pWVar43->nOBSat = (i8)pWVar43->pOrderBy->nExpr;
    }
    if ((pWVar43->wctrlFlags & 0x100) != 0) {
      pWVar43->eDistinct = '\x01';
    }
LAB_00198132:
    if (pWInfo->pOrderBy == (ExprList *)0x0) {
LAB_0019813a:
      if ((db->flags & 0x1000) != 0) {
        pWInfo->revMask = 0xffffffffffffffff;
      }
    }
    if ((pParse->nErr != 0) || (db->mallocFailed != '\0')) goto LAB_001980cd;
    local_120 = 0xffffffffffffffff;
    if ((pResultSet != (ExprList *)0x0) && ((1 < pWInfo->nLevel && ((db->dbOptFlags & 0x100) == 0)))
       ) {
      BVar35 = sqlite3WhereExprListUsage(pMaskSet,pResultSet);
      if (local_c8.pOrderBy != (ExprList *)0x0) {
        BVar36 = sqlite3WhereExprListUsage(pMaskSet,local_c8.pOrderBy);
        BVar35 = BVar35 | BVar36;
      }
      bVar21 = pWInfo->nLevel;
      local_120 = 0xffffffffffffffff;
      uVar73 = (ulong)bVar21;
LAB_00198208:
      uVar49 = uVar73;
      if (1 < (long)uVar49) {
        uVar73 = uVar49 - 1;
        pWVar11 = pWInfo->a[uVar49 - 1].pWLoop;
        if (((pWInfo->pTabList->a[pWVar11->iTab].fg.jointype & 8) != 0) &&
           ((((uVar27 >> 8 & 1) != 0 || ((pWVar11->wsFlags & 0x1000) != 0)) &&
            (uVar54 = pWVar11->maskSelf, (uVar54 & BVar35) == 0)))) {
          pWVar34 = (local_c8.pWC)->a;
          pWVar76 = pWVar34 + (local_c8.pWC)->nTerm;
          for (pWVar67 = pWVar34; pWVar67 < pWVar76; pWVar67 = pWVar67 + 1) {
            if (((pWVar67->prereqAll & uVar54) != 0) &&
               (((pWVar67->pExpr->flags & 1) == 0 ||
                (pWInfo->pTabList->a[pWVar11->iTab].iCursor != (int)pWVar67->pExpr->iRightJoinTable)
                ))) goto LAB_00198208;
          }
          for (; pWVar34 < pWVar76; pWVar34 = pWVar34 + 1) {
            if ((pWVar34->prereqAll & uVar54) != 0) {
              *(byte *)&pWVar34->wtFlags = (byte)pWVar34->wtFlags | 4;
            }
          }
          if (bVar21 != uVar49) {
            memmove(__s + (uVar49 - 1),__s + uVar49,
                    (long)((ulong)((uint)bVar21 - (int)uVar49) * 0x5800000000) >> 0x20);
            bVar21 = pWInfo->nLevel;
          }
          local_120 = local_120 & ~uVar54;
          bVar21 = bVar21 - 1;
          pWInfo->nLevel = bVar21;
          local_190 = local_190 - 1;
        }
        goto LAB_00198208;
      }
    }
    puVar1 = &pWInfo->pParse->nQueryLoop;
    *puVar1 = *puVar1 + (int)pWInfo->nRowOut;
    uVar68 = 0;
    uVar50 = 0;
    if ((uVar27 & 4) != 0) {
      pWVar11 = pWInfo->a[0].pWLoop;
      uVar58 = pWVar11->wsFlags;
      if ((uVar58 >> 0xc & 1) == 0) {
        if (((uVar27 & 8) != 0) && (pTVar52 = pTabList->a[0].pTab, pTVar52->nModuleArg == 0)) {
          uVar20 = '\x02';
          if (((uVar27 & 0x10) != 0) || ((uVar58 & 0x2000) == 0)) goto LAB_001983b2;
          goto LAB_00198471;
        }
        uVar50 = 0;
      }
      else {
        pTVar52 = pTabList->a[0].pTab;
        uVar20 = '\x01';
LAB_001983b2:
        pWInfo->eOnePass = uVar20;
        uVar50 = 0;
        if ((uVar58 & 0x40) == 0) {
LAB_00198471:
          uVar50 = 0;
        }
        else if ((pTVar52->tabFlags & 0x20) == 0) {
          uVar50 = wctrlFlags_00 & 8;
          pWVar11->wsFlags = uVar58 & 0xffffffbf;
        }
      }
    }
    pWVar72 = __s;
    if ((int)local_190 < 1) {
      local_190 = 0;
    }
    for (; uVar68 != local_190; uVar68 = uVar68 + 1) {
      bVar21 = pWVar72->iFrom;
      pTVar52 = pTabList->a[bVar21].pTab;
      iVar25 = sqlite3SchemaToIndex(db,pTVar52->pSchema);
      pWVar11 = pWVar72->pWLoop;
      if (((pTVar52->tabFlags & 2) == 0) && (pTVar52->pSelect == (Select *)0x0)) {
        if ((pWVar11->wsFlags >> 10 & 1) == 0) {
          if (pTVar52->nModuleArg == 0) {
            if ((pWVar11->wsFlags & 0x40) == 0 && uVar56 == 0) {
              iVar51 = pTabList->a[bVar21].iCursor;
              iVar26 = 0x6c;
              if (pWInfo->eOnePass != '\0') {
                pWInfo->aiCurOnePass[0] = iVar51;
                iVar26 = 0x6d;
              }
              sqlite3OpenTable(pParse,iVar51,iVar25,pTVar52,iVar26);
              if (((pWInfo->eOnePass == '\0') && (pTVar52->nCol < 0x40)) &&
                 ((pTVar52->tabFlags & 0x20) == 0)) {
                pcVar53 = (char *)0x0;
                for (uVar73 = pTabList->a[bVar21].colUsed; uVar73 != 0; uVar73 = uVar73 >> 1) {
                  pcVar53 = pcVar53 + 1;
                }
                sqlite3VdbeChangeP4(p,-1,pcVar53,-3);
              }
              if (0 < (long)p->nOp) {
                p->aOp[(long)p->nOp + -1].p5 = uVar50;
              }
            }
            else {
              sqlite3TableLock(pParse,iVar25,pTVar52->tnum,'\0',pTVar52->zName);
            }
          }
        }
        else {
          zP4 = sqlite3GetVTable(db,pTVar52);
          sqlite3VdbeAddOp4(p,0xa3,pTabList->a[bVar21].iCursor,0,0,(char *)zP4,-0xc);
        }
      }
      if ((pWVar11->wsFlags & 0x200) != 0) {
        pIVar60 = (pWVar11->u).btree.pIndex;
        if ((((pTVar52->tabFlags & 0x20) == 0) || (uVar56 == 0)) ||
           ((*(ushort *)&pIVar60->field_0x63 & 3) != 2)) {
          iVar51 = iAuxArg;
          if (pWInfo->eOnePass == '\0') {
            iVar26 = 0x6a;
            if (iAuxArg == 0 || uVar56 == 0) {
              iVar51 = pParse->nTab;
              pParse->nTab = iVar51 + 1;
              iVar26 = 0x6c;
            }
          }
          else {
            ppIVar37 = &(pTabList->a[bVar21].pTab)->pIndex;
            while ((pIVar41 = *ppIVar37, pIVar41 != (Index *)0x0 && (pIVar41 != pIVar60))) {
              iVar51 = iVar51 + 1;
              ppIVar37 = &pIVar41->pNext;
            }
            pWInfo->aiCurOnePass[1] = iVar51;
            iVar26 = 0x6d;
          }
          pWVar72->iIdxCur = iVar51;
          sqlite3VdbeAddOp3(p,iVar26,iVar51,pIVar60->tnum,iVar25);
          sqlite3VdbeSetP4KeyInfo(pParse,pIVar60);
          if (((((pWVar11->wsFlags & 0x8002) == 0 && (pWVar11->wsFlags & 0xf) != 0) &&
               ((pWInfo->wctrlFlags & 1) == 0)) && (pWInfo->eDistinct != '\x02')) &&
             (0 < (long)p->nOp)) {
            p->aOp[(long)p->nOp + -1].p5 = 2;
          }
        }
        else {
          pWVar72->iIdxCur = pWVar72->iTabCur;
        }
      }
      if (-1 < iVar25) {
        sqlite3CodeVerifySchema(pParse,iVar25);
      }
      pWVar72 = pWVar72 + 1;
    }
    pWInfo->iTop = p->nOp;
    if (db->mallocFailed == '\0') {
      local_50 = (ulong)local_190;
      piVar75 = pWInfo[1].aiCurOnePass;
      uVar73 = 0;
      do {
        if (uVar73 == local_50) {
          return pWInfo;
        }
        pWVar72 = __s + uVar73;
        if (((pWInfo->a[uVar73].pWLoop)->wsFlags & 0x4000) != 0) {
          bVar21 = pWVar72->iFrom;
          pSVar62 = pTabList->a + bVar21;
          pVVar12 = pParse->pVdbe;
          iVar51 = sqlite3VdbeAddOp0(pVVar12,0x11);
          pTVar52 = pTabList->a[bVar21].pTab;
          pWVar34 = (pWInfo->sWC).a;
          pWVar67 = pWVar34 + (pWInfo->sWC).nTerm;
          pWVar11 = pWVar72->pWLoop;
          local_1b0 = (Expr *)0x0;
          bVar79 = false;
          local_1a0 = (SrcList *)0x0;
          iVar25 = 0;
          for (; pWVar34 < pWVar67; pWVar34 = pWVar34 + 1) {
            if (((pWVar11->prereq == 0) && ((pWVar34->wtFlags & 2) == 0)) &&
               ((pEVar31 = pWVar34->pExpr, (pEVar31->flags & 1) == 0 &&
                (iVar26 = sqlite3ExprIsTableConstant(pEVar31,pSVar62->iCursor), iVar26 != 0)))) {
              pEVar31 = sqlite3ExprDup(pParse->db,pEVar31,0);
              local_1b0 = sqlite3ExprAnd(pParse,local_1b0,pEVar31);
            }
            iVar26 = termCanDriveIndex(pWVar34,pSVar62,local_120);
            if (iVar26 != 0) {
              iVar26 = (pWVar34->u).leftColumn;
              uVar49 = 1L << ((byte)iVar26 & 0x3f);
              if (0x3f < (long)iVar26) {
                uVar49 = 0x8000000000000000;
              }
              if (!bVar79) {
                sqlite3_log(0x11c,"automatic index on %s(%s)",pTVar52->zName,
                            pTVar52->aCol[iVar26].zName);
              }
              bVar79 = true;
              if (((ulong)local_1a0 & uVar49) == 0) {
                iVar26 = whereLoopResize(pParse->db,pWVar11,iVar25 + 1);
                if (iVar26 != 0) goto LAB_00198dc7;
                pWVar11->aLTerm[iVar25] = pWVar34;
                local_1a0 = (SrcList *)((ulong)local_1a0 | uVar49);
                iVar25 = iVar25 + 1;
              }
            }
          }
          pWVar11->nLTerm = (u16)iVar25;
          (pWVar11->u).btree.nEq = (u16)iVar25;
          pWVar11->wsFlags = 0x4241;
          uVar49 = (~(ulong)local_1a0 | 0x8000000000000000) & pSVar62->colUsed;
          sVar6 = pTVar52->nCol;
          iVar26 = 0x3f;
          if (sVar6 < 0x3f) {
            iVar26 = (int)sVar6;
          }
          if ((short)iVar26 < 1) {
            iVar26 = 0;
          }
          for (uVar54 = 0; (long)iVar26 != uVar54; uVar54 = uVar54 + 1) {
            iVar25 = iVar25 + (uint)((uVar49 >> (uVar54 & 0x3f) & 1) != 0);
          }
          iVar46 = sVar6 + -0x3e;
          if (-1 < (long)pSVar62->colUsed) {
            iVar46 = 1;
          }
          pIVar60 = sqlite3AllocateIndexObject
                              (pParse->db,(i16)(iVar25 + iVar46),0,(char **)local_98);
          if (pIVar60 != (Index *)0x0) {
            (pWVar11->u).btree.pIndex = pIVar60;
            pIVar60->zName = "auto-index";
            pIVar60->pTable = pTVar52;
            pWVar34 = (pWInfo->sWC).a;
            local_180 = 0;
            iVar28 = 0;
            for (; pWVar34 < pWVar67; pWVar34 = pWVar34 + 1) {
              iVar57 = termCanDriveIndex(pWVar34,pSVar62,local_120);
              if (iVar57 != 0) {
                iVar57 = (pWVar34->u).leftColumn;
                uVar54 = 1L << ((byte)iVar57 & 0x3f);
                if (0x3f < iVar57) {
                  uVar54 = 0x8000000000000000;
                }
                if ((local_180 & uVar54) == 0) {
                  pEVar31 = pWVar34->pExpr;
                  pIVar60->aiColumn[iVar28] = (i16)iVar57;
                  pCVar38 = sqlite3BinaryCompareCollSeq(pParse,pEVar31->pLeft,pEVar31->pRight);
                  pcVar53 = "BINARY";
                  if (pCVar38 != (CollSeq *)0x0) {
                    pcVar53 = pCVar38->zName;
                  }
                  local_180 = local_180 | uVar54;
                  pIVar60->azColl[iVar28] = pcVar53;
                  iVar28 = iVar28 + 1;
                }
              }
            }
            for (uVar54 = 0; lVar59 = (long)iVar28, (long)iVar26 != uVar54; uVar54 = uVar54 + 1) {
              if ((uVar49 >> (uVar54 & 0x3f) & 1) != 0) {
                pIVar60->aiColumn[lVar59] = (i16)uVar54;
                pIVar60->azColl[lVar59] = "BINARY";
                iVar28 = iVar28 + 1;
              }
            }
            if ((long)pSVar62->colUsed < 0) {
              for (iVar26 = 0x3f; iVar26 < pTVar52->nCol; iVar26 = iVar26 + 1) {
                pIVar60->aiColumn[lVar59] = (i16)iVar26;
                pIVar60->azColl[lVar59] = "BINARY";
                lVar59 = lVar59 + 1;
              }
              iVar28 = (int)lVar59;
            }
            pIVar60->aiColumn[iVar28] = -1;
            pIVar60->azColl[iVar28] = "BINARY";
            iVar26 = pParse->nTab;
            pParse->nTab = iVar26 + 1;
            pWVar72->iIdxCur = iVar26;
            sqlite3VdbeAddOp2(pVVar12,0x70,iVar26,iVar25 + iVar46);
            sqlite3VdbeSetP4KeyInfo(pParse,pIVar60);
            pSVar70 = pWC->pWInfo->pTabList;
            bVar21 = pWVar72->iFrom;
            if ((pSVar70->a[bVar21].fg.field_0x1 & 0x10) == 0) {
              iVar25 = sqlite3VdbeAddOp1(pVVar12,0x24,pWVar72->iTabCur);
              iVar26 = 0;
            }
            else {
              iVar25 = pSVar70->a[bVar21].regReturn;
              iVar26 = sqlite3VdbeAddOp2(pVVar12,0x46,0,0);
              sqlite3VdbeAddOp3(pVVar12,0xd,iVar25,0,pSVar70->a[bVar21].addrFillSub);
              iVar25 = sqlite3VdbeAddOp1(pVVar12,0xe,iVar25);
            }
            if (local_1b0 == (Expr *)0x0) {
              iVar46 = 0;
            }
            else {
              iVar46 = pParse->nLabel + -1;
              pParse->nLabel = iVar46;
              sqlite3ExprIfFalse(pParse,local_1b0,iVar46,0x10);
              pbVar3 = (byte *)((long)&pWVar11->wsFlags + 2);
              *pbVar3 = *pbVar3 | 2;
            }
            iVar57 = sqlite3GetTempReg(pParse);
            iVar48 = sqlite3GenerateIndexKey
                               (pParse,pIVar60,pWVar72->iTabCur,iVar57,0,(int *)0x0,(Index *)0x0,0);
            sqlite3VdbeAddOp2(pVVar12,0x84,pWVar72->iIdxCur,iVar57);
            if (0 < (long)pVVar12->nOp) {
              pVVar12->aOp[(long)pVVar12->nOp + -1].p5 = 0x10;
            }
            if (local_1b0 != (Expr *)0x0) {
              sqlite3VdbeResolveLabel(pVVar12,iVar46);
            }
            if ((pSVar70->a[bVar21].fg.field_0x1 & 0x10) == 0) {
              sqlite3VdbeAddOp2(pVVar12,5,pWVar72->iTabCur,iVar25 + 1);
            }
            else {
              pVVar44 = sqlite3VdbeGetOp(pVVar12,iVar26);
              pVVar44->p2 = iVar48 + iVar28;
              translateColumnToCopy
                        (pParse,iVar25,pWVar72->iTabCur,pSVar70->a[bVar21].regResult,
                         pWVar72->iIdxCur);
              sqlite3VdbeGoto(pVVar12,iVar25);
              puVar2 = &pSVar70->a[bVar21].fg.field_0x1;
              *puVar2 = *puVar2 & 0xef;
            }
            if (0 < (long)pVVar12->nOp) {
              pVVar12->aOp[(long)pVVar12->nOp + -1].p5 = 3;
            }
            sqlite3VdbeJumpHere(pVVar12,iVar25);
            if (iVar57 != 0) {
              bVar21 = pParse->nTempReg;
              if ((ulong)bVar21 < 8) {
                pParse->nTempReg = bVar21 + 1;
                pParse->aTempReg[bVar21] = iVar57;
              }
            }
            sqlite3VdbeJumpHere(pVVar12,iVar51);
          }
LAB_00198dc7:
          sqlite3ExprDelete(pParse->db,local_1b0);
          if (db->mallocFailed != '\0') goto LAB_001980c8;
        }
        sqlite3WhereExplainOneScan(pParse,pTabList,pWVar72,wctrlFlags_00);
        pWVar72->addrBody = p->nOp;
        psVar13 = pParse->db;
        pWVar11 = pWVar72->pWLoop;
        pSVar70 = pWInfo->pTabList;
        uVar54 = (ulong)pWVar72->iFrom;
        iVar51 = pSVar70->a[uVar54].iCursor;
        BVar35 = sqlite3WhereGetMask(pMaskSet,iVar51);
        pWVar72->notReady = ~BVar35 & local_120;
        uVar49 = pWInfo->revMask >> ((byte)uVar73 & 0x3f);
        iVar25 = pParse->nLabel + -1;
        iVar26 = pParse->nLabel + -2;
        pWVar72->addrNxt = iVar25;
        pWVar72->addrBrk = iVar25;
        pParse->nLabel = iVar26;
        pWVar72->addrCont = iVar26;
        if ((uVar54 != 0) && ((pSVar70->a[uVar54].fg.jointype & 8) != 0)) {
          iVar46 = pParse->nMem + 1;
          pParse->nMem = iVar46;
          pWVar72->iLeftJoin = iVar46;
          sqlite3VdbeAddOp2(p,0x46,0,iVar46);
        }
        uVar27 = (uint)uVar49 & 1;
        for (uVar40 = uVar73 & 0xffffffff; 0 < (int)uVar40; uVar40 = (ulong)((int)uVar40 - 1)) {
          if (__s[uVar40].iLeftJoin != 0) goto LAB_00198f10;
        }
        uVar40 = 0;
LAB_00198f10:
        bVar21 = pSVar70->a[uVar54].fg.field_0x1;
        if ((bVar21 & 0x10) == 0) {
          uVar56 = pWVar11->wsFlags;
          if ((uVar56 >> 10 & 1) != 0) {
            uVar9 = pWVar11->nLTerm;
            uVar49 = (ulong)uVar9;
            iVar46 = sqlite3GetTempRange(pParse,uVar9 + 2);
            iVar25 = pWVar72->addrBrk;
            for (uVar40 = 0; uVar49 != uVar40; uVar40 = uVar40 + 1) {
              pWVar34 = pWVar11->aLTerm[uVar40];
              if (pWVar34 != (WhereTerm *)0x0) {
                iVar28 = iVar46 + 2 + (int)uVar40;
                if ((pWVar34->eOperator & 1) == 0) {
                  codeExprOrVector(pParse,pWVar34->pExpr->pRight,iVar28,1);
                }
                else {
                  codeEqualityTerm(pParse,pWVar34,pWVar72,(int)uVar40,uVar27,iVar28);
                  iVar25 = pWVar72->addrNxt;
                }
              }
            }
            sqlite3VdbeAddOp2(p,0x46,(pWVar11->u).vtab.idxNum,iVar46);
            sqlite3VdbeAddOp2(p,0x46,(uint)uVar9,iVar46 + 1);
            sqlite3VdbeAddOp4(p,9,iVar51,iVar25,iVar46,(pWVar11->u).vtab.idxStr,
                              -(uint)((pWVar11->u).vtab.needFree == '\0') | 0xfffffff9);
            (pWVar11->u).vtab.needFree = '\0';
            pWVar72->p1 = iVar51;
            uVar20 = 0xaa;
            if (pWInfo->eOnePass == '\0') {
              uVar20 = '<';
            }
            pWVar72->op = uVar20;
            pWVar72->p2 = p->nOp;
            iVar25 = (pWVar72->u).in.nIn;
            while (0 < (long)uVar49) {
              pWVar34 = pWVar11->aLTerm[uVar49 - 1];
              iVar28 = (int)uVar49;
              if ((uVar49 < 0x11) && (((pWVar11->u).btree.nIdxCol >> (iVar28 - 1U & 0x1f) & 1) != 0)
                 ) {
                disableTerm(pWVar72,pWVar34);
LAB_0019914b:
                uVar49 = uVar49 - 1;
              }
              else {
                if ((pWVar34->eOperator & 1) == 0) goto LAB_0019914b;
                if (psVar13->mallocFailed == '\0') {
                  iVar25 = iVar25 + -1;
                  pVVar44 = sqlite3VdbeGetOp(p,(pWVar72->u).in.aInLoop[iVar25].addrInTop);
                  sqlite3VdbeAddOp3(p,(uint)pVVar44->opcode,pVVar44->p1,pVVar44->p2,pVVar44->p3);
                }
                uVar49 = uVar49 - 1;
                pEVar31 = sqlite3PExpr(pParse,0x35,(Expr *)0x0,(Expr *)0x0);
                if (pEVar31 != (Expr *)0x0) {
                  pEVar31->pLeft = pWVar34->pExpr->pLeft;
                  pEVar32 = sqlite3Expr(psVar13,0xa8,(char *)0x0);
                  pEVar31->pRight = pEVar32;
                  if (pEVar32 != (Expr *)0x0) {
                    pEVar32->iTable = iVar28 + iVar46 + 1;
                    sqlite3ExprIfFalse(pParse,pEVar31,pWVar72->addrCont,0);
                  }
                  pEVar31->pLeft = (Expr *)0x0;
                  sqlite3ExprDeleteNN(psVar13,pEVar31);
                }
              }
            }
            goto LAB_00198fc3;
          }
          if ((uVar56 & 5) != 0 && (uVar56 >> 8 & 1) != 0) {
            pWVar34 = *pWVar11->aLTerm;
            iVar46 = pParse->nMem;
            iVar25 = iVar46 + 1;
            pParse->nMem = iVar25;
            iVar25 = codeEqualityTerm(pParse,pWVar34,pWVar72,0,uVar27,iVar25);
            iVar46 = iVar46 + 1;
            if ((iVar46 != 0) && (iVar25 != iVar46)) {
              bVar21 = pParse->nTempReg;
              if ((ulong)bVar21 < 8) {
                pParse->nTempReg = bVar21 + 1;
                pParse->aTempReg[bVar21] = iVar46;
              }
            }
            sqlite3VdbeAddOp3(p,0x1e,iVar51,pWVar72->addrNxt,iVar25);
            pWVar72->op = 0xaa;
            if ((pWVar34->prereqAll & pWVar72->notReady) == 0) {
              *(byte *)&pWVar34->wtFlags = (byte)pWVar34->wtFlags | 4;
            }
LAB_0019a772:
            pIVar60 = (Index *)0x0;
            goto LAB_0019a777;
          }
          iVar46 = pWInfo->a[uVar40].addrBrk;
          if ((~uVar56 & 0x102) == 0) {
            pWVar34 = (WhereTerm *)0x0;
            bVar79 = (uVar56 & 0x20) != 0;
            if (bVar79) {
              pWVar34 = *pWVar11->aLTerm;
            }
            if ((uVar56 & 0x10) == 0) {
              pWVar67 = (WhereTerm *)0x0;
            }
            else {
              pWVar67 = pWVar11->aLTerm[bVar79];
            }
            pWVar76 = pWVar67;
            if ((uVar49 & 1) == 0) {
              pWVar76 = pWVar34;
              pWVar34 = pWVar67;
            }
            if (pWVar76 == (WhereTerm *)0x0) {
              sqlite3VdbeAddOp2(p,(uint)((uVar49 & 1) == 0) * 4 + 0x20,iVar51,iVar46);
            }
            else {
              pEVar31 = pWVar76->pExpr;
              pEVar32 = pEVar31->pRight;
              iVar46 = sqlite3ExprIsVector(pEVar32);
              if (iVar46 == 0) {
                iVar28 = sqlite3ExprCodeTemp(pParse,pEVar32,(int *)local_98);
                disableTerm(pWVar72,pWVar76);
                uVar40 = (ulong)pEVar31->op - 0x36;
                iVar46 = local_98._0_4_;
              }
              else {
                iVar28 = sqlite3GetTempReg(pParse);
                codeExprOrVector(pParse,pEVar31->pRight,iVar28,1);
                uVar40 = (ulong)(byte)((pEVar31->op + 1 & 2) + 1);
                iVar46 = iVar28;
              }
              sqlite3VdbeAddOp3(p,(uint)(byte)(&DAT_001cf25c)[uVar40],iVar51,iVar25,iVar28);
              if (iVar46 != 0) {
                bVar21 = pParse->nTempReg;
                if ((ulong)bVar21 < 8) {
                  pParse->nTempReg = bVar21 + 1;
                  pParse->aTempReg[bVar21] = iVar46;
                }
              }
            }
            if (pWVar34 == (WhereTerm *)0x0) {
              iVar28 = 0xaa;
              iVar46 = 0;
            }
            else {
              pEVar31 = pWVar34->pExpr;
              iVar46 = pParse->nMem + 1;
              pParse->nMem = iVar46;
              codeExprOrVector(pParse,pEVar31->pRight,iVar46,1);
              iVar28 = sqlite3ExprIsVector(pEVar31->pRight);
              if (iVar28 == 0) {
                if ((pEVar31->op == '6') || (pEVar31->op == '8')) {
                  iVar28 = (uint)((uVar49 & 1) == 0) * 2 + 0x37;
                }
                else {
                  iVar28 = uVar27 * 2 + 0x36;
                }
                disableTerm(pWVar72,pWVar34);
              }
              else {
                iVar28 = uVar27 * 2 + 0x36;
              }
            }
            iVar57 = p->nOp;
            pWVar72->op = (byte)uVar27 ^ 5;
            pWVar72->p1 = iVar51;
            pWVar72->p2 = iVar57;
            if (iVar28 != 0xaa) {
              iVar57 = pParse->nMem + 1;
              pParse->nMem = iVar57;
              sqlite3VdbeAddOp2(p,0x80,iVar51,iVar57);
              sqlite3VdbeAddOp3(p,iVar28,iVar46,iVar25,iVar57);
              if (0 < (long)p->nOp) {
                p->aOp[(long)p->nOp + -1].p5 = 0x53;
              }
            }
            goto LAB_0019a772;
          }
          if ((uVar56 >> 9 & 1) != 0) {
            uVar9 = (pWVar11->u).btree.nEq;
            uVar40 = (ulong)uVar9;
            pIVar60 = (pWVar11->u).btree.pIndex;
            bVar79 = false;
            uVar68 = 0;
            if ((pWInfo->wctrlFlags & 1) != 0) {
              if (pWInfo->nOBSat < '\x01') {
                bVar79 = false;
                uVar68 = 0;
              }
              else {
                bVar79 = uVar9 < pIVar60->nKeyCol;
                uVar68 = (uint)bVar79;
              }
            }
            uVar8 = (pWVar11->u).btree.nBtm;
            if ((uVar56 & 0x20) == 0) {
              pWVar34 = (WhereTerm *)0x0;
              uVar71 = uVar40;
              uVar58 = uVar68;
            }
            else {
              uVar58 = (uint)uVar8;
              uVar71 = (ulong)(uVar9 + 1);
              pWVar34 = pWVar11->aLTerm[uVar40];
              if (uVar8 < uVar68) {
                uVar58 = 1;
              }
            }
            uVar5 = (pWVar11->u).btree.nTop;
            iVar25 = pWVar72->iIdxCur;
            if ((uVar56 & 0x10) == 0) {
              local_148 = (WhereTerm *)0x0;
              local_140 = uVar58;
            }
            else {
              local_140 = (uint)uVar5;
              if (uVar5 < uVar58) {
                local_140 = uVar58;
              }
              local_148 = pWVar11->aLTerm[uVar71];
              if ((local_148->wtFlags & 0x100) != 0) {
                uVar47 = pParse->nMem + 1;
                pParse->nMem = uVar47;
                pWVar72->iLikeRepCntr = uVar47;
                sqlite3VdbeAddOp2(p,0x46,1,uVar47);
                pWVar72->addrLikeRep = p->nOp;
                uVar47 = pWVar72->iLikeRepCntr;
                pWVar72->iLikeRepCntr = uVar47 * 2;
                pWVar72->iLikeRepCntr =
                     (pIVar60->aSortOrder[uVar40] == '\x01' ^ uVar27) + uVar47 * 2;
              }
              if (pWVar34 == (WhereTerm *)0x0) {
                sVar6 = pIVar60->aiColumn[uVar40];
                if ((long)sVar6 < 0) {
                  if (sVar6 == -2) goto LAB_00199736;
                }
                else if (pIVar60->pTable->aCol[sVar6].notNull == '\0') {
LAB_00199736:
                  bVar79 = true;
                }
              }
            }
            local_158 = (uint)uVar5;
            if (((uVar9 < pIVar60->nKeyCol) &&
                (((pIVar60->aSortOrder[uVar40] != '\0' ^ (byte)uVar49) & 1) != 0)) ||
               (((uVar49 & 1) != 0 && (pIVar60->nKeyCol == uVar9)))) {
              local_158 = (uint)(byte)uVar8;
              bVar18 = !bVar79;
              bVar79 = false;
              local_118 = (Index *)pWVar34;
              uVar8 = uVar5;
            }
            else {
              bVar18 = true;
              local_118 = (Index *)local_148;
              local_148 = pWVar34;
            }
            db_00 = pParse->db;
            pVVar12 = pParse->pVdbe;
            pWVar16 = pWVar72->pWLoop;
            uVar5 = (pWVar16->u).btree.nEq;
            uVar7 = pWVar16->nSkip;
            uVar56 = (uint)uVar7;
            pIVar41 = (pWVar16->u).btree.pIndex;
            iVar46 = pParse->nMem + 1;
            iVar28 = local_140 + uVar5;
            pParse->nMem = pParse->nMem + iVar28;
            pcVar53 = sqlite3IndexAffinityStr(db_00,pIVar41);
            pcVar53 = sqlite3DbStrDup(db_00,pcVar53);
            if (uVar7 != 0) {
              iVar57 = pWVar72->iIdxCur;
              bVar80 = (uVar49 & 1) == 0;
              sqlite3VdbeAddOp1(pVVar12,(uint)bVar80 * 4 + 0x20,iVar57);
              iVar48 = sqlite3VdbeAddOp0(pVVar12,0xb);
              iVar29 = sqlite3VdbeAddOp4Int(pVVar12,(uint)bVar80 * 3 + 0x16,iVar57,0,iVar46,uVar56);
              pWVar72->addrSkip = iVar29;
              sqlite3VdbeJumpHere(pVVar12,iVar48);
              for (uVar68 = 0; uVar56 != uVar68; uVar68 = uVar68 + 1) {
                sqlite3VdbeAddOp3(pVVar12,0x5a,iVar57,uVar68,iVar46 + uVar68);
              }
            }
            for (uVar71 = (ulong)uVar56; uVar71 < uVar5; uVar71 = uVar71 + 1) {
              pWVar34 = pWVar16->aLTerm[uVar71];
              iVar57 = (int)uVar71;
              iVar30 = iVar46 + iVar57;
              iVar29 = codeEqualityTerm(pParse,pWVar34,pWVar72,iVar57,uVar27,iVar30);
              iVar48 = iVar46;
              if (iVar30 != iVar29) {
                if (iVar28 == 1) {
                  iVar48 = iVar29;
                  if (iVar46 != 0) {
                    bVar21 = pParse->nTempReg;
                    if ((ulong)bVar21 < 8) {
                      pParse->nTempReg = bVar21 + 1;
                      pParse->aTempReg[bVar21] = iVar46;
                    }
                  }
                }
                else {
                  sqlite3VdbeAddOp2(pVVar12,0x4f,iVar29,iVar30);
                }
              }
              iVar46 = iVar48;
              if ((pWVar34->eOperator & 1) == 0) {
                if ((pWVar34->eOperator >> 8 & 1) == 0) {
                  pEVar31 = pWVar34->pExpr->pRight;
                  if (((pWVar34->wtFlags & 0x800) == 0) &&
                     (iVar48 = sqlite3ExprCanBeNull(pEVar31), iVar48 != 0)) {
                    sqlite3VdbeAddOp2(pVVar12,0x32,iVar57 + iVar46,pWVar72->addrBrk);
                  }
                  if (pcVar53 != (char *)0x0) {
                    cVar22 = sqlite3CompareAffinity(pEVar31,pcVar53[uVar71]);
                    if (cVar22 == 'A') {
                      pcVar53[uVar71] = 'A';
                      cVar22 = 'A';
                    }
                    else {
                      cVar22 = pcVar53[uVar71];
                    }
                    iVar57 = sqlite3ExprNeedsNoAffinityChange(pEVar31,cVar22);
                    if (iVar57 != 0) goto LAB_00199a47;
                  }
                }
              }
              else if (((pWVar34->pExpr->flags & 0x800) != 0) && (pcVar53 != (char *)0x0)) {
LAB_00199a47:
                pcVar53[uVar71] = 'A';
              }
            }
            if (pcVar53 == (char *)0x0) {
              zAff = (char *)0x0;
            }
            else {
              zAff = (char *)0x0;
              if ((short)local_158 != 0) {
                zAff = sqlite3DbStrDup(psVar13,pcVar53 + uVar40);
              }
            }
            iVar28 = pWVar72->addrNxt;
            uVar56 = 1;
            uVar68 = 1;
            if (local_148 != (WhereTerm *)0x0) {
              uVar68 = (uint)((local_148->eOperator & 0x28) != 0);
            }
            if (local_118 != (Index *)0x0) {
              uVar56 = (uint)((*(u16 *)((long)local_118 + 0x14) & 0x28) != 0);
            }
            uVar58 = (uint)uVar9;
            if (local_148 == (WhereTerm *)0x0) {
              uVar77 = (uint)(uVar40 != 0);
              if (bVar79) {
                uVar68 = 0;
                sqlite3VdbeAddOp2(p,0x49,0,iVar46 + uVar58);
                uVar40 = (ulong)(uVar58 + 1);
                uVar77 = 1;
                iVar57 = -1;
              }
              else {
                iVar57 = 0;
              }
            }
            else {
              pEVar31 = local_148->pExpr->pRight;
              iVar48 = iVar46 + (uint)uVar9;
              codeExprOrVector(pParse,pEVar31,iVar48,(uint)uVar8);
              whereLikeOptimizationStringFixup(p,pWVar72,local_148);
              iVar57 = sqlite3ExprCanBeNull(pEVar31);
              if (iVar57 != 0) {
                sqlite3VdbeAddOp2(p,0x32,iVar48,iVar28);
              }
              if (pcVar53 != (char *)0x0) {
                updateRangeAffinityStr(pEVar31,(uint)uVar8,pcVar53 + uVar40);
              }
              uVar40 = (ulong)((uint)uVar8 + (uint)uVar9);
              iVar48 = sqlite3ExprIsVector(pEVar31);
              uVar77 = 1;
              iVar57 = 0;
              if (iVar48 == 0) {
                disableTerm(pWVar72,local_148);
              }
              else {
                uVar68 = 1;
              }
            }
            p4 = (uint)uVar40;
            codeApplyAffinity(pParse,iVar46,iVar57 + p4,pcVar53);
            if ((pWVar11->nSkip == 0) || (p4 != pWVar11->nSkip)) {
              if ((pWVar11->wsFlags & 0x40000) != 0) {
                sqlite3VdbeAddOp1(p,0x77,iVar25);
              }
              sqlite3VdbeAddOp4Int
                        (p,(uint)*(byte *)((long)&sqlite3WhereCodeOneLoopStart_aStartOp +
                                          (ulong)(uVar77 * 4 + uVar68 * 2 + uVar27)),iVar25,iVar28,
                         iVar46,p4);
            }
            if (local_118 == (Index *)0x0) {
              if (!bVar18) {
                uVar56 = 0;
                sqlite3VdbeAddOp2(p,0x49,0,iVar46 + uVar58);
                uVar58 = uVar58 + 1;
              }
            }
            else {
              pEVar31 = ((Expr *)local_118->zName)->pRight;
              iVar48 = iVar46 + uVar58;
              codeExprOrVector(pParse,pEVar31,iVar48,local_158);
              whereLikeOptimizationStringFixup(p,pWVar72,(WhereTerm *)local_118);
              iVar57 = sqlite3ExprCanBeNull(pEVar31);
              if (iVar57 != 0) {
                sqlite3VdbeAddOp2(p,0x32,iVar48,iVar28);
              }
              if (zAff != (char *)0x0) {
                updateRangeAffinityStr(pEVar31,local_158,zAff);
                codeApplyAffinity(pParse,iVar48,local_158,zAff);
              }
              uVar58 = local_158 + uVar58;
              iVar57 = sqlite3ExprIsVector(pEVar31);
              if (iVar57 == 0) {
                disableTerm(pWVar72,(WhereTerm *)local_118);
              }
              else {
                uVar56 = 1;
              }
            }
            sqlite3DbFree(psVar13,pcVar53);
            sqlite3DbFree(psVar13,zAff);
            pWVar72->p2 = p->nOp;
            if (uVar58 != 0) {
              sqlite3VdbeAddOp4Int
                        (p,(uint)*(byte *)((long)&sqlite3WhereCodeOneLoopStart_aEndOp +
                                          (ulong)(uVar56 + uVar27 * 2)),iVar25,iVar28,iVar46,uVar58)
              ;
            }
            uVar27 = pWVar11->wsFlags;
            if ((uVar27 >> 0x12 & 1) != 0) {
              sqlite3VdbeAddOp2(p,0x77,iVar25,1);
              uVar27 = pWVar11->wsFlags;
            }
            if (((uVar27 & 0x40) == 0) || (bVar79 = true, (pWInfo->wctrlFlags & 0x20) != 0)) {
              if ((pIVar60->pTable->tabFlags & 0x20) == 0) {
                if (((pWInfo->wctrlFlags >> 10 & 1) == 0) &&
                   (((pWInfo->wctrlFlags >> 0xc & 1) == 0 || (pWInfo->eOnePass != '\x01')))) {
                  pPVar17 = pWInfo->pParse;
                  pVVar12 = pPVar17->pVdbe;
                  bVar79 = false;
                  sqlite3VdbeAddOp3(pVVar12,0x86,iVar25,0,iVar51);
                  if ((pWInfo->wctrlFlags & 0x20) != 0) {
                    pPVar42 = pPVar17->pToplevel;
                    if (pPVar17->pToplevel == (Parse *)0x0) {
                      pPVar42 = pPVar17;
                    }
                    if (pPVar42->writeMask == 0) {
                      pTVar52 = pIVar60->pTable;
                      piVar45 = (int *)sqlite3DbMallocZero(pPVar17->db,(long)pTVar52->nCol * 4 + 4);
                      if (piVar45 != (int *)0x0) {
                        *piVar45 = (int)pTVar52->nCol;
                        iVar46 = *(int *)&pIVar60->nColumn;
                        for (uVar40 = 0;
                            (iVar46 + (uint)((short)iVar46 == 0) & 0xffff) - 1 != uVar40;
                            uVar40 = uVar40 + 1) {
                          if (-1 < pIVar60->aiColumn[uVar40]) {
                            piVar45[(ulong)(ushort)pIVar60->aiColumn[uVar40] + 1] = (int)uVar40 + 1;
                          }
                        }
                        sqlite3VdbeChangeP4(pVVar12,-1,(char *)piVar45,-0xf);
                        goto LAB_0019a029;
                      }
                    }
                    bVar79 = false;
                  }
                  goto LAB_0019a02e;
                }
                iVar46 = pParse->nMem + 1;
                pParse->nMem = iVar46;
                sqlite3VdbeAddOp2(p,0x87,iVar25,iVar46);
                sqlite3VdbeAddOp3(p,0x1f,iVar51,0,iVar46);
              }
              else if (iVar51 != iVar25) {
                pIVar41 = sqlite3PrimaryKeyIndex(pIVar60->pTable);
                iVar46 = sqlite3GetTempRange(pParse,(uint)pIVar41->nKeyCol);
                for (uVar40 = 0; uVar40 < pIVar41->nKeyCol; uVar40 = uVar40 + 1) {
                  iVar24 = sqlite3ColumnOfIndex(pIVar60,pIVar41->aiColumn[uVar40]);
                  sqlite3VdbeAddOp3(p,0x5a,iVar25,(int)iVar24,iVar46 + (int)uVar40);
                }
                sqlite3VdbeAddOp4Int(p,0x1c,iVar51,iVar26,iVar46,(uint)pIVar41->nKeyCol);
              }
LAB_0019a029:
              bVar79 = false;
            }
LAB_0019a02e:
            if (((pWVar72->iLeftJoin == 0) && ((pWInfo->wctrlFlags & 0x20) == 0)) &&
               (pEVar63 = pIVar60->aColExpr, pEVar63 != (ExprList *)0x0)) {
              local_98._32_8_ = (ExprList *)0x0;
              local_98._0_8_ = (Parse *)0x0;
              local_98._16_8_ = (Expr *)0x0;
              local_98._24_8_ = (Expr *)0x0;
              local_98._8_8_ = whereIndexExprTransNode;
              aStack_70.pNC = (NameContext *)&local_48;
              pEVar69 = pEVar63->a;
              local_40 = iVar51;
              local_3c = iVar25;
              for (lVar59 = 0; lVar59 < pEVar63->nExpr; lVar59 = lVar59 + 1) {
                if (pIVar60->aiColumn[lVar59] == -2) {
                  local_38 = (undefined4)lVar59;
                  local_48 = pEVar69->pExpr;
                  sqlite3WalkExpr((Walker *)local_98,pWInfo->pWhere);
                  sqlite3WalkExprList((Walker *)local_98,pWInfo->pOrderBy);
                  sqlite3WalkExprList((Walker *)local_98,pWInfo->pResultSet);
                }
                pEVar69 = pEVar69 + 1;
              }
            }
            if (pIVar60->pPartIdxWhere != (Expr *)0x0) {
              whereApplyPartialIndexConstraints(pIVar60->pPartIdxWhere,iVar51,pWC);
            }
            uVar27 = pWVar11->wsFlags;
            if ((uVar27 >> 0xc & 1) == 0) {
              if ((uVar49 & 1) == 0) {
                pWVar72->op = '\x05';
              }
              else {
                pWVar72->op = '\x04';
              }
            }
            else {
              pWVar72->op = 0xaa;
            }
            pWVar72->p1 = iVar25;
            pWVar72->p3 = (byte)(uVar27 >> 0x10) & 1;
            if ((uVar27 & 0xf) == 0) {
              pWVar72->p5 = '\x01';
            }
            if (bVar79) {
              pIVar60 = (Index *)0x0;
            }
            goto LAB_0019a777;
          }
          if ((uVar56 >> 0xd & 1) == 0) {
            if ((bVar21 & 0x20) == 0) {
              uVar49 = (ulong)((uint)uVar49 & 1);
              pWVar72->op = *(u8 *)((long)&sqlite3WhereCodeOneLoopStart_aStep + uVar49);
              pWVar72->p1 = iVar51;
              iVar25 = sqlite3VdbeAddOp2(p,(uint)*(byte *)((long)&
                                                  sqlite3WhereCodeOneLoopStart_aStart + uVar49),
                                         iVar51,iVar46);
              pWVar72->p2 = iVar25 + 1;
              pWVar72->p5 = '\x01';
            }
            else {
              pWVar72->op = 0xaa;
            }
            pIVar60 = (Index *)0x0;
            goto LAB_0019a777;
          }
          iVar25 = pParse->nTab;
          pParse->nTab = iVar25 + 1;
          iVar28 = pParse->nMem + 1;
          pParse->nMem = iVar28;
          iVar46 = pParse->nLabel + -1;
          pParse->nLabel = iVar46;
          pTVar52 = pSVar70->a[uVar54].pTab;
          pWVar34 = *pWVar11->aLTerm;
          pWVar14 = (pWVar34->u).pOrInfo;
          pWVar72->op = 'B';
          pWVar72->p1 = iVar28;
          if (pWInfo->nLevel < 2) {
            local_1a0 = pWInfo->pTabList;
LAB_00199bef:
            iVar57 = 0;
            iVar48 = 0;
            if ((pWInfo->wctrlFlags & 0x10) == 0) {
              if ((pTVar52->tabFlags & 0x20) == 0) {
                iVar57 = pParse->nMem + 1;
                pParse->nMem = iVar57;
                sqlite3VdbeAddOp2(p,0x49,0,iVar57);
              }
              else {
                pIVar60 = sqlite3PrimaryKeyIndex(pTVar52);
                iVar57 = pParse->nTab;
                pParse->nTab = iVar57 + 1;
                sqlite3VdbeAddOp2(p,0x71,iVar57,(uint)pIVar60->nKeyCol);
                sqlite3VdbeSetP4KeyInfo(pParse,pIVar60);
              }
              iVar48 = pParse->nMem + 1;
              pParse->nMem = iVar48;
            }
            iVar30 = sqlite3VdbeAddOp2(p,0x46,0,iVar28);
            iVar29 = (pWInfo->sWC).nTerm;
            if (iVar29 < 2) {
              local_1a8 = (Expr *)0x0;
            }
            else {
              lVar78 = 0;
              pEVar31 = (Expr *)0x0;
              for (lVar59 = 0; lVar59 < iVar29; lVar59 = lVar59 + 1) {
                pWVar67 = (pWInfo->sWC).a;
                if ((((WhereTerm *)((long)&pWVar67->pExpr + lVar78) != pWVar34) &&
                    ((*(byte *)((long)&pWVar67->wtFlags + lVar78) & 6) == 0)) &&
                   ((*(ushort *)((long)&pWVar67->eOperator + lVar78) & 0x1fff) != 0)) {
                  pEVar32 = sqlite3ExprDup(psVar13,*(Expr **)((long)&pWVar67->pExpr + lVar78),0);
                  pEVar31 = sqlite3ExprAnd(pParse,pEVar31,pEVar32);
                  iVar29 = (pWInfo->sWC).nTerm;
                }
                lVar78 = lVar78 + 0x40;
              }
              if (pEVar31 == (Expr *)0x0) {
                local_1a8 = (Expr *)0x0;
              }
              else {
                local_1a8 = sqlite3PExpr(pParse,0x1002c,(Expr *)0x0,pEVar31);
              }
            }
            uVar9 = pWInfo->wctrlFlags;
            sqlite3VdbeExplain(pParse,'\x01',"MULTI-INDEX OR");
            local_118 = (Index *)0x0;
            bVar79 = false;
            uVar49 = 0;
            while (uVar40 = uVar49, (long)uVar40 < (long)(pWVar14->wc).nTerm) {
              pWVar76 = (pWVar14->wc).a;
              pWVar67 = pWVar76 + uVar40;
              if ((pWVar76[uVar40].leftCursor == iVar51) || ((pWVar67->eOperator & 0x400) != 0)) {
                pEVar31 = pWVar67->pExpr;
                if (local_1a8 != (Expr *)0x0) {
                  local_1a8->pLeft = pEVar31;
                  pEVar31 = local_1a8;
                }
                sqlite3VdbeExplain(pParse,'\x01',"INDEX %d");
                pWVar43 = sqlite3WhereBegin(pParse,local_1a0,pEVar31,(ExprList *)0x0,(ExprList *)0x0
                                            ,uVar9 & 0x400 | 0x20,iVar25);
                uVar49 = uVar40 + 1;
                if (pWVar43 != (WhereInfo *)0x0) {
                  local_e4 = 0;
                  sqlite3WhereExplainOneScan(pParse,local_1a0,pWVar43->a,0);
                  if ((pWInfo->wctrlFlags & 0x10) == 0) {
                    uVar71 = uVar40;
                    if (uVar40 == (pWVar14->wc).nTerm - 1) {
                      uVar71 = 0xffffffffffffffff;
                    }
                    iVar29 = (int)uVar71;
                    if ((pTVar52->tabFlags & 0x20) == 0) {
                      sqlite3VdbeAddOp2(p,0x80,iVar51,iVar48);
                      local_e4 = sqlite3VdbeAddOp4Int(p,0x2a,iVar57,0,iVar48,iVar29);
                    }
                    else {
                      pIVar60 = sqlite3PrimaryKeyIndex(pTVar52);
                      uVar8 = pIVar60->nKeyCol;
                      p3 = sqlite3GetTempRange(pParse,(uint)uVar8);
                      for (uVar71 = 0; uVar8 != uVar71; uVar71 = uVar71 + 1) {
                        sqlite3ExprCodeGetColumnOfTable
                                  (p,pTVar52,iVar51,(int)pIVar60->aiColumn[uVar71],p3 + (int)uVar71)
                        ;
                      }
                      uVar27 = (uint)uVar8;
                      if (iVar29 == 0) {
                        local_e4 = 0;
LAB_0019a576:
                        sqlite3VdbeAddOp3(p,0x5c,p3,uVar27,iVar48);
                        sqlite3VdbeAddOp4Int(p,0x84,iVar57,iVar48,p3,uVar27);
                        if ((iVar29 != 0) && (0 < (long)p->nOp)) {
                          p->aOp[(long)p->nOp + -1].p5 = 0x10;
                        }
                      }
                      else {
                        local_e4 = sqlite3VdbeAddOp4Int(p,0x1d,iVar57,0,p3,uVar27);
                        if (-1 < iVar29) goto LAB_0019a576;
                      }
                      sqlite3ReleaseTempRange(pParse,p3,uVar27);
                    }
                  }
                  sqlite3VdbeAddOp2(p,0xc,iVar28,iVar46);
                  if (local_e4 != 0) {
                    sqlite3VdbeJumpHere(p,local_e4);
                  }
                  if (pWVar43->untestedTerms != '\0') {
                    bVar79 = true;
                  }
                  pWVar11 = pWVar43->a[0].pWLoop;
                  if (((pWVar11->wsFlags & 0x200) == 0) ||
                     ((pIVar60 = (pWVar11->u).btree.pIndex, uVar40 != 0 && (pIVar60 != local_118))))
                  {
                    pIVar60 = (Index *)0x0;
                  }
                  else if (((pTVar52->tabFlags & 0x20) != 0) &&
                          ((*(ushort *)&pIVar60->field_0x63 & 3) == 2)) {
                    pIVar60 = (Index *)0x0;
                  }
                  sqlite3WhereEnd(pWVar43);
                  sqlite3VdbeExplainPop(pParse);
                  local_118 = pIVar60;
                }
              }
              else {
                uVar49 = uVar40 + 1;
              }
            }
            sqlite3VdbeExplainPop(pParse);
            (pWVar72->u).pCovidx = local_118;
            if (local_118 != (Index *)0x0) {
              pWVar72->iIdxCur = iVar25;
            }
            if (local_1a8 != (Expr *)0x0) {
              local_1a8->pLeft = (Expr *)0x0;
              sqlite3ExprDeleteNN(psVar13,local_1a8);
            }
            iVar25 = p->nOp;
            pVVar44 = sqlite3VdbeGetOp(p,iVar30);
            pVVar44->p1 = iVar25;
            sqlite3VdbeGoto(p,pWVar72->addrBrk);
            sqlite3VdbeResolveLabel(p,iVar46);
            if (1 < pWInfo->nLevel) {
              sqlite3DbFree(psVar13,local_1a0);
            }
            if (!bVar79) {
              disableTerm(pWVar72,pWVar34);
            }
            goto LAB_0019a772;
          }
          local_f8 = (int)uVar73;
          uVar27 = (uint)pWInfo->nLevel - local_f8;
          local_1a0 = (SrcList *)sqlite3DbMallocRaw(psVar13,(long)(int)(uVar27 - 1) * 0x70 + 0x78);
          if (local_1a0 != (SrcList *)0x0) {
            local_1a0->nAlloc = uVar27 & 0xff;
            local_1a0->nSrc = uVar27 & 0xff;
            pSVar62 = pSVar70->a + uVar54;
            pSVar64 = local_1a0->a;
            for (lVar59 = 0xe; lVar59 != 0; lVar59 = lVar59 + -1) {
              pSVar64->pSchema = pSVar62->pSchema;
              pSVar62 = (SrcList_item *)((long)pSVar62 + ((ulong)bVar81 * -2 + 1) * 8);
              pSVar64 = (SrcList_item *)((long)pSVar64 + (ulong)bVar81 * -0x10 + 8);
            }
            pSVar15 = pWInfo->pTabList;
            pSVar39 = local_1a0 + 1;
            piVar45 = piVar75;
            for (lVar59 = 1; lVar59 < (int)uVar27; lVar59 = lVar59 + 1) {
              pSVar62 = pSVar15->a + (byte)*piVar45;
              pSVar65 = pSVar39;
              for (lVar78 = 0xe; lVar78 != 0; lVar78 = lVar78 + -1) {
                *(Schema **)pSVar65 = pSVar62->pSchema;
                pSVar62 = (SrcList_item *)((long)pSVar62 + (ulong)bVar81 * -0x10 + 8);
                pSVar65 = (SrcList *)((long)pSVar65 + (ulong)bVar81 * -0x10 + 8);
              }
              pSVar39 = (SrcList *)&pSVar39->a[0].pIBIndex;
              piVar45 = piVar45 + 0x16;
            }
            goto LAB_00199bef;
          }
        }
        else {
          iVar46 = pSVar70->a[uVar54].regReturn;
          sqlite3VdbeAddOp3(p,0xd,iVar46,0,pSVar70->a[uVar54].addrFillSub);
          iVar25 = sqlite3VdbeAddOp2(p,0xe,iVar46,iVar25);
          pWVar72->p2 = iVar25;
          pWVar72->op = '\v';
LAB_00198fc3:
          pIVar60 = (Index *)0x0;
LAB_0019a777:
          bVar21 = (pIVar60 == (Index *)0x0) + 1;
          do {
            pWVar34 = (pWInfo->sWC).a;
            bVar55 = 0;
            for (iVar25 = (pWInfo->sWC).nTerm; 0 < iVar25; iVar25 = iVar25 + -1) {
              uVar9 = pWVar34->wtFlags;
              bVar4 = bVar55;
              if ((uVar9 & 6) == 0) {
                if ((pWVar34->prereqAll & pWVar72->notReady) == 0) {
                  pEVar31 = pWVar34->pExpr;
                  if (((pSVar70->a[uVar54].fg.jointype & 8) == 0) || ((pEVar31->flags & 1) != 0)) {
                    if (bVar21 == 1) {
                      iVar46 = sqlite3ExprCoveredByIndex(pEVar31,pWVar72->iTabCur,pIVar60);
                      bVar4 = 2;
                      if (iVar46 != 0) {
                        uVar9 = pWVar34->wtFlags;
LAB_0019a80c:
                        if ((uVar9 >> 0xc & 1) == 0) goto LAB_0019a812;
                        bVar4 = bVar55;
                        if (bVar55 == 0) {
                          bVar4 = 3;
                        }
                      }
                    }
                    else {
                      if (bVar21 < 3) goto LAB_0019a80c;
LAB_0019a812:
                      iVar46 = 0;
                      if (((uVar9 >> 9 & 1) != 0) &&
                         (uVar27 = pWVar72->iLikeRepCntr, iVar46 = 0, uVar27 != 0)) {
                        iVar46 = sqlite3VdbeAddOp1(p,(uVar27 & 1) * 2 + 0x12,uVar27 >> 1);
                      }
                      sqlite3ExprIfFalse(pParse,pEVar31,iVar26,0x10);
                      if (iVar46 != 0) {
                        sqlite3VdbeJumpHere(p,iVar46);
                      }
                      *(byte *)&pWVar34->wtFlags = (byte)pWVar34->wtFlags | 4;
                      bVar4 = bVar55;
                    }
                  }
                }
                else {
                  pWInfo->untestedTerms = '\x01';
                }
              }
              bVar55 = bVar4;
              pWVar34 = pWVar34 + 1;
            }
            bVar21 = bVar55;
          } while (bVar55 != 0);
          paVar61 = &((pWInfo->sWC).a)->u;
          for (iVar25 = (pWInfo->sWC).nTerm; 0 < iVar25; iVar25 = iVar25 + -1) {
            if ((((((ulong)paVar61->pOrInfo & 0x60000) == 0) &&
                 ((*(u16 *)((long)paVar61 + -0x14) >> 0xb & 1) != 0 &&
                  (*(u16 *)((long)paVar61 + -0x14) & 0x82) != 0)) &&
                (*(int *)((long)paVar61 + -0xc) == iVar51)) && (pWVar72->iLeftJoin == 0)) {
              pEVar31 = ((WhereTerm *)(paVar61 + -5))->pExpr;
              pWVar34 = sqlite3WhereFindTerm
                                  (pWC,iVar51,paVar61->leftColumn,local_120,0x83,(Index *)0x0);
              if (((pWVar34 != (WhereTerm *)0x0) && ((pWVar34->wtFlags & 4) == 0)) &&
                 ((pEVar32 = pWVar34->pExpr, (pWVar34->eOperator & 1) == 0 ||
                  (((pEVar32->flags & 0x800) == 0 || (((pEVar32->x).pSelect)->pEList->nExpr < 2)))))
                 ) {
                pEVar66 = (Expr *)local_98;
                for (lVar59 = 9; lVar59 != 0; lVar59 = lVar59 + -1) {
                  cVar22 = pEVar32->affinity;
                  uVar19 = *(undefined2 *)&pEVar32->field_0x2;
                  uVar47 = pEVar32->flags;
                  pEVar66->op = pEVar32->op;
                  pEVar66->affinity = cVar22;
                  *(undefined2 *)&pEVar66->field_0x2 = uVar19;
                  pEVar66->flags = uVar47;
                  pEVar32 = (Expr *)((long)pEVar32 + ((ulong)bVar81 * -2 + 1) * 8);
                  pEVar66 = (Expr *)((long)pEVar66 + (ulong)bVar81 * -0x10 + 8);
                }
                local_98._16_8_ = pEVar31->pLeft;
                sqlite3ExprIfFalse(pParse,(Expr *)local_98,iVar26,0x10);
              }
            }
            paVar61 = paVar61 + 8;
          }
          if (pWVar72->iLeftJoin != 0) {
            pWVar72->addrFirst = p->nOp;
            sqlite3VdbeAddOp2(p,0x46,1,pWVar72->iLeftJoin);
            pWVar34 = (pWInfo->sWC).a;
            for (iVar25 = 0; iVar25 < (pWInfo->sWC).nTerm; iVar25 = iVar25 + 1) {
              if (((pWVar34->wtFlags & 6) == 0) && ((pWVar34->prereqAll & pWVar72->notReady) == 0))
              {
                sqlite3ExprIfFalse(pParse,pWVar34->pExpr,iVar26,0x10);
                *(byte *)&pWVar34->wtFlags = (byte)pWVar34->wtFlags | 4;
              }
              pWVar34 = pWVar34 + 1;
            }
          }
          local_120 = pWVar72->notReady;
        }
        pWInfo->iContinue = pWVar72->addrCont;
        uVar73 = uVar73 + 1;
        piVar75 = piVar75 + 0x16;
      } while( true );
    }
    goto LAB_001980cd;
  }
LAB_00197ec9:
  pWVar11 = local_c8.pNew;
  pSVar15 = (local_c8.pWInfo)->pTabList;
  bVar21 = (local_c8.pWInfo)->nLevel;
  psVar13 = (local_c8.pWInfo)->pParse->db;
  (local_c8.pNew)->aLTerm = (local_c8.pNew)->aLTermSpace;
  (local_c8.pNew)->nLTerm = 0;
  (local_c8.pNew)->nLSlot = 3;
  (local_c8.pNew)->wsFlags = 0;
  local_c8.iPlanLimit = 20000;
  pMaskSet_00 = &(local_c8.pWInfo)->sMaskSet;
  pSVar39 = pSVar15 + 1;
  uVar20 = '\0';
  local_1c0 = 0;
  local_188 = 0;
  bVar55 = 0;
  for (pSVar70 = (SrcList *)pSVar15->a; pSVar70 < (SrcList *)(pSVar15->a + bVar21);
      pSVar70 = (SrcList *)&pSVar70->a[0].pIBIndex) {
    pWVar11->iTab = uVar20;
    local_c8.iPlanLimit = local_c8.iPlanLimit + 1000;
    BVar35 = sqlite3WhereGetMask(pMaskSet_00,pSVar70->a[0].regResult);
    pWVar11->maskSelf = BVar35;
    bVar4 = ((anon_struct_4_7_7ffbf296_for_fg *)&pSVar70->a[0].regReturn)->jointype;
    if (((bVar55 | bVar4) & 10) != 0) {
      local_188 = local_1c0;
    }
    if (((Table *)pSVar70->a[0].zAlias)->nModuleArg == 0) {
      iVar25 = whereLoopAddBtree(&local_c8,local_188);
      uVar73 = 0;
    }
    else {
      uVar73 = 0;
      for (pSVar65 = pSVar39; pSVar65 < (SrcList *)(pSVar15->a + bVar21);
          pSVar65 = (SrcList *)&pSVar65->a[0].pIBIndex) {
        if ((uVar73 == 0) && ((pSVar65->a[0].regReturn & 10) == 0)) {
          uVar73 = 0;
        }
        else {
          BVar35 = sqlite3WhereGetMask(pMaskSet_00,pSVar65->a[0].regResult);
          uVar73 = BVar35 | uVar73;
        }
      }
      iVar25 = whereLoopAddVirtual(&local_c8,local_188,uVar73);
    }
    if (iVar25 == 0) {
      if ((local_c8.pWC)->hasOr != '\0') {
        iVar25 = whereLoopAddOr(&local_c8,local_188,uVar73);
        goto LAB_00198024;
      }
      local_1c0 = local_1c0 | pWVar11->maskSelf;
LAB_0019806a:
      if (psVar13->mallocFailed != '\0') break;
    }
    else {
LAB_00198024:
      local_1c0 = local_1c0 | pWVar11->maskSelf;
      if (iVar25 != 0x65) {
        if (iVar25 == 0) goto LAB_0019806a;
        goto LAB_00198097;
      }
      sqlite3_log(0x1c,"abbreviated query algorithm search");
    }
    uVar20 = uVar20 + '\x01';
    pSVar39 = (SrcList *)&pSVar39->a[0].pIBIndex;
    bVar55 = bVar4;
  }
  iVar25 = 0;
LAB_00198097:
  whereLoopClear(psVar13,pWVar11);
  if ((iVar25 == 0) && (wherePathSolver(pWInfo,0), db->mallocFailed == '\0')) {
    if (pWInfo->pOrderBy != (ExprList *)0x0) {
      wherePathSolver(pWInfo,(short)*(undefined4 *)&pWInfo->nRowOut + 1);
      if (db->mallocFailed != '\0') goto LAB_001980cd;
      goto LAB_00198132;
    }
    goto LAB_0019813a;
  }
  goto LAB_001980c8;
}

Assistant:

SQLITE_PRIVATE WhereInfo *sqlite3WhereBegin(
  Parse *pParse,          /* The parser context */
  SrcList *pTabList,      /* FROM clause: A list of all tables to be scanned */
  Expr *pWhere,           /* The WHERE clause */
  ExprList *pOrderBy,     /* An ORDER BY (or GROUP BY) clause, or NULL */
  ExprList *pResultSet,   /* Query result set.  Req'd for DISTINCT */
  u16 wctrlFlags,         /* The WHERE_* flags defined in sqliteInt.h */
  int iAuxArg             /* If WHERE_OR_SUBCLAUSE is set, index cursor number
                          ** If WHERE_USE_LIMIT, then the limit amount */
){
  int nByteWInfo;            /* Num. bytes allocated for WhereInfo struct */
  int nTabList;              /* Number of elements in pTabList */
  WhereInfo *pWInfo;         /* Will become the return value of this function */
  Vdbe *v = pParse->pVdbe;   /* The virtual database engine */
  Bitmask notReady;          /* Cursors that are not yet positioned */
  WhereLoopBuilder sWLB;     /* The WhereLoop builder */
  WhereMaskSet *pMaskSet;    /* The expression mask set */
  WhereLevel *pLevel;        /* A single level in pWInfo->a[] */
  WhereLoop *pLoop;          /* Pointer to a single WhereLoop object */
  int ii;                    /* Loop counter */
  sqlite3 *db;               /* Database connection */
  int rc;                    /* Return code */
  u8 bFordelete = 0;         /* OPFLAG_FORDELETE or zero, as appropriate */

  assert( (wctrlFlags & WHERE_ONEPASS_MULTIROW)==0 || (
        (wctrlFlags & WHERE_ONEPASS_DESIRED)!=0 
     && (wctrlFlags & WHERE_OR_SUBCLAUSE)==0 
  ));

  /* Only one of WHERE_OR_SUBCLAUSE or WHERE_USE_LIMIT */
  assert( (wctrlFlags & WHERE_OR_SUBCLAUSE)==0
            || (wctrlFlags & WHERE_USE_LIMIT)==0 );

  /* Variable initialization */
  db = pParse->db;
  memset(&sWLB, 0, sizeof(sWLB));

  /* An ORDER/GROUP BY clause of more than 63 terms cannot be optimized */
  testcase( pOrderBy && pOrderBy->nExpr==BMS-1 );
  if( pOrderBy && pOrderBy->nExpr>=BMS ) pOrderBy = 0;
  sWLB.pOrderBy = pOrderBy;

  /* Disable the DISTINCT optimization if SQLITE_DistinctOpt is set via
  ** sqlite3_test_ctrl(SQLITE_TESTCTRL_OPTIMIZATIONS,...) */
  if( OptimizationDisabled(db, SQLITE_DistinctOpt) ){
    wctrlFlags &= ~WHERE_WANT_DISTINCT;
  }

  /* The number of tables in the FROM clause is limited by the number of
  ** bits in a Bitmask 
  */
  testcase( pTabList->nSrc==BMS );
  if( pTabList->nSrc>BMS ){
    sqlite3ErrorMsg(pParse, "at most %d tables in a join", BMS);
    return 0;
  }

  /* This function normally generates a nested loop for all tables in 
  ** pTabList.  But if the WHERE_OR_SUBCLAUSE flag is set, then we should
  ** only generate code for the first table in pTabList and assume that
  ** any cursors associated with subsequent tables are uninitialized.
  */
  nTabList = (wctrlFlags & WHERE_OR_SUBCLAUSE) ? 1 : pTabList->nSrc;

  /* Allocate and initialize the WhereInfo structure that will become the
  ** return value. A single allocation is used to store the WhereInfo
  ** struct, the contents of WhereInfo.a[], the WhereClause structure
  ** and the WhereMaskSet structure. Since WhereClause contains an 8-byte
  ** field (type Bitmask) it must be aligned on an 8-byte boundary on
  ** some architectures. Hence the ROUND8() below.
  */
  nByteWInfo = ROUND8(sizeof(WhereInfo)+(nTabList-1)*sizeof(WhereLevel));
  pWInfo = sqlite3DbMallocRawNN(db, nByteWInfo + sizeof(WhereLoop));
  if( db->mallocFailed ){
    sqlite3DbFree(db, pWInfo);
    pWInfo = 0;
    goto whereBeginError;
  }
  pWInfo->pParse = pParse;
  pWInfo->pTabList = pTabList;
  pWInfo->pOrderBy = pOrderBy;
  pWInfo->pWhere = pWhere;
  pWInfo->pResultSet = pResultSet;
  pWInfo->aiCurOnePass[0] = pWInfo->aiCurOnePass[1] = -1;
  pWInfo->nLevel = nTabList;
  pWInfo->iBreak = pWInfo->iContinue = sqlite3VdbeMakeLabel(pParse);
  pWInfo->wctrlFlags = wctrlFlags;
  pWInfo->iLimit = iAuxArg;
  pWInfo->savedNQueryLoop = pParse->nQueryLoop;
  memset(&pWInfo->nOBSat, 0, 
         offsetof(WhereInfo,sWC) - offsetof(WhereInfo,nOBSat));
  memset(&pWInfo->a[0], 0, sizeof(WhereLoop)+nTabList*sizeof(WhereLevel));
  assert( pWInfo->eOnePass==ONEPASS_OFF );  /* ONEPASS defaults to OFF */
  pMaskSet = &pWInfo->sMaskSet;
  sWLB.pWInfo = pWInfo;
  sWLB.pWC = &pWInfo->sWC;
  sWLB.pNew = (WhereLoop*)(((char*)pWInfo)+nByteWInfo);
  assert( EIGHT_BYTE_ALIGNMENT(sWLB.pNew) );
  whereLoopInit(sWLB.pNew);
#ifdef SQLITE_DEBUG
  sWLB.pNew->cId = '*';
#endif

  /* Split the WHERE clause into separate subexpressions where each
  ** subexpression is separated by an AND operator.
  */
  initMaskSet(pMaskSet);
  sqlite3WhereClauseInit(&pWInfo->sWC, pWInfo);
  sqlite3WhereSplit(&pWInfo->sWC, pWhere, TK_AND);
    
  /* Special case: No FROM clause
  */
  if( nTabList==0 ){
    if( pOrderBy ) pWInfo->nOBSat = pOrderBy->nExpr;
    if( wctrlFlags & WHERE_WANT_DISTINCT ){
      pWInfo->eDistinct = WHERE_DISTINCT_UNIQUE;
    }
    ExplainQueryPlan((pParse, 0, "SCAN CONSTANT ROW"));
  }else{
    /* Assign a bit from the bitmask to every term in the FROM clause.
    **
    ** The N-th term of the FROM clause is assigned a bitmask of 1<<N.
    **
    ** The rule of the previous sentence ensures thta if X is the bitmask for
    ** a table T, then X-1 is the bitmask for all other tables to the left of T.
    ** Knowing the bitmask for all tables to the left of a left join is
    ** important.  Ticket #3015.
    **
    ** Note that bitmasks are created for all pTabList->nSrc tables in
    ** pTabList, not just the first nTabList tables.  nTabList is normally
    ** equal to pTabList->nSrc but might be shortened to 1 if the
    ** WHERE_OR_SUBCLAUSE flag is set.
    */
    ii = 0;
    do{
      createMask(pMaskSet, pTabList->a[ii].iCursor);
      sqlite3WhereTabFuncArgs(pParse, &pTabList->a[ii], &pWInfo->sWC);
    }while( (++ii)<pTabList->nSrc );
  #ifdef SQLITE_DEBUG
    {
      Bitmask mx = 0;
      for(ii=0; ii<pTabList->nSrc; ii++){
        Bitmask m = sqlite3WhereGetMask(pMaskSet, pTabList->a[ii].iCursor);
        assert( m>=mx );
        mx = m;
      }
    }
  #endif
  }
  
  /* Analyze all of the subexpressions. */
  sqlite3WhereExprAnalyze(pTabList, &pWInfo->sWC);
  if( db->mallocFailed ) goto whereBeginError;

  /* Special case: WHERE terms that do not refer to any tables in the join
  ** (constant expressions). Evaluate each such term, and jump over all the
  ** generated code if the result is not true.  
  **
  ** Do not do this if the expression contains non-deterministic functions
  ** that are not within a sub-select. This is not strictly required, but
  ** preserves SQLite's legacy behaviour in the following two cases:
  **
  **   FROM ... WHERE random()>0;           -- eval random() once per row
  **   FROM ... WHERE (SELECT random())>0;  -- eval random() once overall
  */
  for(ii=0; ii<sWLB.pWC->nTerm; ii++){
    WhereTerm *pT = &sWLB.pWC->a[ii];
    if( pT->wtFlags & TERM_VIRTUAL ) continue;
    if( pT->prereqAll==0 && (nTabList==0 || exprIsDeterministic(pT->pExpr)) ){
      sqlite3ExprIfFalse(pParse, pT->pExpr, pWInfo->iBreak, SQLITE_JUMPIFNULL);
      pT->wtFlags |= TERM_CODED;
    }
  }

  if( wctrlFlags & WHERE_WANT_DISTINCT ){
    if( isDistinctRedundant(pParse, pTabList, &pWInfo->sWC, pResultSet) ){
      /* The DISTINCT marking is pointless.  Ignore it. */
      pWInfo->eDistinct = WHERE_DISTINCT_UNIQUE;
    }else if( pOrderBy==0 ){
      /* Try to ORDER BY the result set to make distinct processing easier */
      pWInfo->wctrlFlags |= WHERE_DISTINCTBY;
      pWInfo->pOrderBy = pResultSet;
    }
  }

  /* Construct the WhereLoop objects */
#if defined(WHERETRACE_ENABLED)
  if( sqlite3WhereTrace & 0xffff ){
    sqlite3DebugPrintf("*** Optimizer Start *** (wctrlFlags: 0x%x",wctrlFlags);
    if( wctrlFlags & WHERE_USE_LIMIT ){
      sqlite3DebugPrintf(", limit: %d", iAuxArg);
    }
    sqlite3DebugPrintf(")\n");
  }
  if( sqlite3WhereTrace & 0x100 ){ /* Display all terms of the WHERE clause */
    sqlite3WhereClausePrint(sWLB.pWC);
  }
#endif

  if( nTabList!=1 || whereShortCut(&sWLB)==0 ){
    rc = whereLoopAddAll(&sWLB);
    if( rc ) goto whereBeginError;
  
#ifdef WHERETRACE_ENABLED
    if( sqlite3WhereTrace ){    /* Display all of the WhereLoop objects */
      WhereLoop *p;
      int i;
      static const char zLabel[] = "0123456789abcdefghijklmnopqrstuvwyxz"
                                             "ABCDEFGHIJKLMNOPQRSTUVWYXZ";
      for(p=pWInfo->pLoops, i=0; p; p=p->pNextLoop, i++){
        p->cId = zLabel[i%(sizeof(zLabel)-1)];
        whereLoopPrint(p, sWLB.pWC);
      }
    }
#endif
  
    wherePathSolver(pWInfo, 0);
    if( db->mallocFailed ) goto whereBeginError;
    if( pWInfo->pOrderBy ){
       wherePathSolver(pWInfo, pWInfo->nRowOut+1);
       if( db->mallocFailed ) goto whereBeginError;
    }
  }
  if( pWInfo->pOrderBy==0 && (db->flags & SQLITE_ReverseOrder)!=0 ){
     pWInfo->revMask = ALLBITS;
  }
  if( pParse->nErr || NEVER(db->mallocFailed) ){
    goto whereBeginError;
  }
#ifdef WHERETRACE_ENABLED
  if( sqlite3WhereTrace ){
    sqlite3DebugPrintf("---- Solution nRow=%d", pWInfo->nRowOut);
    if( pWInfo->nOBSat>0 ){
      sqlite3DebugPrintf(" ORDERBY=%d,0x%llx", pWInfo->nOBSat, pWInfo->revMask);
    }
    switch( pWInfo->eDistinct ){
      case WHERE_DISTINCT_UNIQUE: {
        sqlite3DebugPrintf("  DISTINCT=unique");
        break;
      }
      case WHERE_DISTINCT_ORDERED: {
        sqlite3DebugPrintf("  DISTINCT=ordered");
        break;
      }
      case WHERE_DISTINCT_UNORDERED: {
        sqlite3DebugPrintf("  DISTINCT=unordered");
        break;
      }
    }
    sqlite3DebugPrintf("\n");
    for(ii=0; ii<pWInfo->nLevel; ii++){
      whereLoopPrint(pWInfo->a[ii].pWLoop, sWLB.pWC);
    }
  }
#endif

  /* Attempt to omit tables from the join that do not affect the result.
  ** For a table to not affect the result, the following must be true:
  **
  **   1) The query must not be an aggregate.
  **   2) The table must be the RHS of a LEFT JOIN.
  **   3) Either the query must be DISTINCT, or else the ON or USING clause
  **      must contain a constraint that limits the scan of the table to 
  **      at most a single row.
  **   4) The table must not be referenced by any part of the query apart
  **      from its own USING or ON clause.
  **
  ** For example, given:
  **
  **     CREATE TABLE t1(ipk INTEGER PRIMARY KEY, v1);
  **     CREATE TABLE t2(ipk INTEGER PRIMARY KEY, v2);
  **     CREATE TABLE t3(ipk INTEGER PRIMARY KEY, v3);
  **
  ** then table t2 can be omitted from the following:
  **
  **     SELECT v1, v3 FROM t1 
  **       LEFT JOIN t2 USING (t1.ipk=t2.ipk)
  **       LEFT JOIN t3 USING (t1.ipk=t3.ipk)
  **
  ** or from:
  **
  **     SELECT DISTINCT v1, v3 FROM t1 
  **       LEFT JOIN t2
  **       LEFT JOIN t3 USING (t1.ipk=t3.ipk)
  */
  notReady = ~(Bitmask)0;
  if( pWInfo->nLevel>=2
   && pResultSet!=0               /* guarantees condition (1) above */
   && OptimizationEnabled(db, SQLITE_OmitNoopJoin)
  ){
    int i;
    Bitmask tabUsed = sqlite3WhereExprListUsage(pMaskSet, pResultSet);
    if( sWLB.pOrderBy ){
      tabUsed |= sqlite3WhereExprListUsage(pMaskSet, sWLB.pOrderBy);
    }
    for(i=pWInfo->nLevel-1; i>=1; i--){
      WhereTerm *pTerm, *pEnd;
      struct SrcList_item *pItem;
      pLoop = pWInfo->a[i].pWLoop;
      pItem = &pWInfo->pTabList->a[pLoop->iTab];
      if( (pItem->fg.jointype & JT_LEFT)==0 ) continue;
      if( (wctrlFlags & WHERE_WANT_DISTINCT)==0
       && (pLoop->wsFlags & WHERE_ONEROW)==0
      ){
        continue;
      }
      if( (tabUsed & pLoop->maskSelf)!=0 ) continue;
      pEnd = sWLB.pWC->a + sWLB.pWC->nTerm;
      for(pTerm=sWLB.pWC->a; pTerm<pEnd; pTerm++){
        if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
          if( !ExprHasProperty(pTerm->pExpr, EP_FromJoin)
           || pTerm->pExpr->iRightJoinTable!=pItem->iCursor
          ){
            break;
          }
        }
      }
      if( pTerm<pEnd ) continue;
      WHERETRACE(0xffff, ("-> drop loop %c not used\n", pLoop->cId));
      notReady &= ~pLoop->maskSelf;
      for(pTerm=sWLB.pWC->a; pTerm<pEnd; pTerm++){
        if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
          pTerm->wtFlags |= TERM_CODED;
        }
      }
      if( i!=pWInfo->nLevel-1 ){
        int nByte = (pWInfo->nLevel-1-i) * sizeof(WhereLevel);
        memmove(&pWInfo->a[i], &pWInfo->a[i+1], nByte);
      }
      pWInfo->nLevel--;
      nTabList--;
    }
  }
  WHERETRACE(0xffff,("*** Optimizer Finished ***\n"));
  pWInfo->pParse->nQueryLoop += pWInfo->nRowOut;

  /* If the caller is an UPDATE or DELETE statement that is requesting
  ** to use a one-pass algorithm, determine if this is appropriate.
  **
  ** A one-pass approach can be used if the caller has requested one
  ** and either (a) the scan visits at most one row or (b) each
  ** of the following are true:
  **
  **   * the caller has indicated that a one-pass approach can be used
  **     with multiple rows (by setting WHERE_ONEPASS_MULTIROW), and
  **   * the table is not a virtual table, and
  **   * either the scan does not use the OR optimization or the caller
  **     is a DELETE operation (WHERE_DUPLICATES_OK is only specified
  **     for DELETE).
  **
  ** The last qualification is because an UPDATE statement uses
  ** WhereInfo.aiCurOnePass[1] to determine whether or not it really can
  ** use a one-pass approach, and this is not set accurately for scans
  ** that use the OR optimization.
  */
  assert( (wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || pWInfo->nLevel==1 );
  if( (wctrlFlags & WHERE_ONEPASS_DESIRED)!=0 ){
    int wsFlags = pWInfo->a[0].pWLoop->wsFlags;
    int bOnerow = (wsFlags & WHERE_ONEROW)!=0;
    assert( !(wsFlags & WHERE_VIRTUALTABLE) || IsVirtual(pTabList->a[0].pTab) );
    if( bOnerow || (
        0!=(wctrlFlags & WHERE_ONEPASS_MULTIROW)
     && !IsVirtual(pTabList->a[0].pTab)
     && (0==(wsFlags & WHERE_MULTI_OR) || (wctrlFlags & WHERE_DUPLICATES_OK))
    )){
      pWInfo->eOnePass = bOnerow ? ONEPASS_SINGLE : ONEPASS_MULTI;
      if( HasRowid(pTabList->a[0].pTab) && (wsFlags & WHERE_IDX_ONLY) ){
        if( wctrlFlags & WHERE_ONEPASS_MULTIROW ){
          bFordelete = OPFLAG_FORDELETE;
        }
        pWInfo->a[0].pWLoop->wsFlags = (wsFlags & ~WHERE_IDX_ONLY);
      }
    }
  }

  /* Open all tables in the pTabList and any indices selected for
  ** searching those tables.
  */
  for(ii=0, pLevel=pWInfo->a; ii<nTabList; ii++, pLevel++){
    Table *pTab;     /* Table to open */
    int iDb;         /* Index of database containing table/index */
    struct SrcList_item *pTabItem;

    pTabItem = &pTabList->a[pLevel->iFrom];
    pTab = pTabItem->pTab;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    pLoop = pLevel->pWLoop;
    if( (pTab->tabFlags & TF_Ephemeral)!=0 || pTab->pSelect ){
      /* Do nothing */
    }else
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)!=0 ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      int iCur = pTabItem->iCursor;
      sqlite3VdbeAddOp4(v, OP_VOpen, iCur, 0, 0, pVTab, P4_VTAB);
    }else if( IsVirtual(pTab) ){
      /* noop */
    }else
#endif
    if( (pLoop->wsFlags & WHERE_IDX_ONLY)==0
         && (wctrlFlags & WHERE_OR_SUBCLAUSE)==0 ){
      int op = OP_OpenRead;
      if( pWInfo->eOnePass!=ONEPASS_OFF ){
        op = OP_OpenWrite;
        pWInfo->aiCurOnePass[0] = pTabItem->iCursor;
      };
      sqlite3OpenTable(pParse, pTabItem->iCursor, iDb, pTab, op);
      assert( pTabItem->iCursor==pLevel->iTabCur );
      testcase( pWInfo->eOnePass==ONEPASS_OFF && pTab->nCol==BMS-1 );
      testcase( pWInfo->eOnePass==ONEPASS_OFF && pTab->nCol==BMS );
      if( pWInfo->eOnePass==ONEPASS_OFF && pTab->nCol<BMS && HasRowid(pTab) ){
        Bitmask b = pTabItem->colUsed;
        int n = 0;
        for(; b; b=b>>1, n++){}
        sqlite3VdbeChangeP4(v, -1, SQLITE_INT_TO_PTR(n), P4_INT32);
        assert( n<=pTab->nCol );
      }
#ifdef SQLITE_ENABLE_CURSOR_HINTS
      if( pLoop->u.btree.pIndex!=0 ){
        sqlite3VdbeChangeP5(v, OPFLAG_SEEKEQ|bFordelete);
      }else
#endif
      {
        sqlite3VdbeChangeP5(v, bFordelete);
      }
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
      sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, pTabItem->iCursor, 0, 0,
                            (const u8*)&pTabItem->colUsed, P4_INT64);
#endif
    }else{
      sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);
    }
    if( pLoop->wsFlags & WHERE_INDEXED ){
      Index *pIx = pLoop->u.btree.pIndex;
      int iIndexCur;
      int op = OP_OpenRead;
      /* iAuxArg is always set to a positive value if ONEPASS is possible */
      assert( iAuxArg!=0 || (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0 );
      if( !HasRowid(pTab) && IsPrimaryKeyIndex(pIx)
       && (wctrlFlags & WHERE_OR_SUBCLAUSE)!=0
      ){
        /* This is one term of an OR-optimization using the PRIMARY KEY of a
        ** WITHOUT ROWID table.  No need for a separate index */
        iIndexCur = pLevel->iTabCur;
        op = 0;
      }else if( pWInfo->eOnePass!=ONEPASS_OFF ){
        Index *pJ = pTabItem->pTab->pIndex;
        iIndexCur = iAuxArg;
        assert( wctrlFlags & WHERE_ONEPASS_DESIRED );
        while( ALWAYS(pJ) && pJ!=pIx ){
          iIndexCur++;
          pJ = pJ->pNext;
        }
        op = OP_OpenWrite;
        pWInfo->aiCurOnePass[1] = iIndexCur;
      }else if( iAuxArg && (wctrlFlags & WHERE_OR_SUBCLAUSE)!=0 ){
        iIndexCur = iAuxArg;
        op = OP_ReopenIdx;
      }else{
        iIndexCur = pParse->nTab++;
      }
      pLevel->iIdxCur = iIndexCur;
      assert( pIx->pSchema==pTab->pSchema );
      assert( iIndexCur>=0 );
      if( op ){
        sqlite3VdbeAddOp3(v, op, iIndexCur, pIx->tnum, iDb);
        sqlite3VdbeSetP4KeyInfo(pParse, pIx);
        if( (pLoop->wsFlags & WHERE_CONSTRAINT)!=0
         && (pLoop->wsFlags & (WHERE_COLUMN_RANGE|WHERE_SKIPSCAN))==0
         && (pWInfo->wctrlFlags&WHERE_ORDERBY_MIN)==0
         && pWInfo->eDistinct!=WHERE_DISTINCT_ORDERED
        ){
          sqlite3VdbeChangeP5(v, OPFLAG_SEEKEQ); /* Hint to COMDB2 */
        }
        VdbeComment((v, "%s", pIx->zName));
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
        {
          u64 colUsed = 0;
          int ii, jj;
          for(ii=0; ii<pIx->nColumn; ii++){
            jj = pIx->aiColumn[ii];
            if( jj<0 ) continue;
            if( jj>63 ) jj = 63;
            if( (pTabItem->colUsed & MASKBIT(jj))==0 ) continue;
            colUsed |= ((u64)1)<<(ii<63 ? ii : 63);
          }
          sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, iIndexCur, 0, 0,
                                (u8*)&colUsed, P4_INT64);
        }
#endif /* SQLITE_ENABLE_COLUMN_USED_MASK */
      }
    }
    if( iDb>=0 ) sqlite3CodeVerifySchema(pParse, iDb);
  }
  pWInfo->iTop = sqlite3VdbeCurrentAddr(v);
  if( db->mallocFailed ) goto whereBeginError;

  /* Generate the code to do the search.  Each iteration of the for
  ** loop below generates code for a single nested loop of the VM
  ** program.
  */
  for(ii=0; ii<nTabList; ii++){
    int addrExplain;
    int wsFlags;
    pLevel = &pWInfo->a[ii];
    wsFlags = pLevel->pWLoop->wsFlags;
#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
    if( (pLevel->pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 ){
      constructAutomaticIndex(pParse, &pWInfo->sWC,
                &pTabList->a[pLevel->iFrom], notReady, pLevel);
      if( db->mallocFailed ) goto whereBeginError;
    }
#endif
    addrExplain = sqlite3WhereExplainOneScan(
        pParse, pTabList, pLevel, wctrlFlags
    );
    pLevel->addrBody = sqlite3VdbeCurrentAddr(v);
    notReady = sqlite3WhereCodeOneLoopStart(pParse,v,pWInfo,ii,pLevel,notReady);
    pWInfo->iContinue = pLevel->addrCont;
    if( (wsFlags&WHERE_MULTI_OR)==0 && (wctrlFlags&WHERE_OR_SUBCLAUSE)==0 ){
      sqlite3WhereAddScanStatus(v, pTabList, pLevel, addrExplain);
    }
  }

  /* Done. */
  VdbeModuleComment((v, "Begin WHERE-core"));
  return pWInfo;

  /* Jump here if malloc fails */
whereBeginError:
  if( pWInfo ){
    pParse->nQueryLoop = pWInfo->savedNQueryLoop;
    whereInfoFree(db, pWInfo);
  }
  return 0;
}